

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_scale_rtcd.h
# Opt level: O0

void setup_rtcd_internal(void)

{
  uint uVar1;
  int flags;
  
  uVar1 = x86_simd_caps();
  aom_avg_8x8_quad = aom_avg_8x8_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_avg_8x8_quad = aom_avg_8x8_quad_avx2;
  }
  aom_blend_a64_hmask = aom_blend_a64_hmask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_blend_a64_hmask = aom_blend_a64_hmask_sse4_1;
  }
  aom_blend_a64_mask = aom_blend_a64_mask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_blend_a64_mask = aom_blend_a64_mask_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_blend_a64_mask = aom_blend_a64_mask_avx2;
  }
  aom_blend_a64_vmask = aom_blend_a64_vmask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_blend_a64_vmask = aom_blend_a64_vmask_sse4_1;
  }
  aom_comp_avg_pred = aom_comp_avg_pred_c;
  if ((uVar1 & 0x80) != 0) {
    aom_comp_avg_pred = aom_comp_avg_pred_avx2;
  }
  aom_comp_mask_pred = aom_comp_mask_pred_c;
  if ((uVar1 & 0x10) != 0) {
    aom_comp_mask_pred = aom_comp_mask_pred_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_comp_mask_pred = aom_comp_mask_pred_avx2;
  }
  aom_compute_correlation = aom_compute_correlation_c;
  if ((uVar1 & 0x20) != 0) {
    aom_compute_correlation = aom_compute_correlation_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_compute_correlation = aom_compute_correlation_avx2;
  }
  aom_compute_flow_at_point = aom_compute_flow_at_point_c;
  if ((uVar1 & 0x20) != 0) {
    aom_compute_flow_at_point = aom_compute_flow_at_point_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_compute_flow_at_point = aom_compute_flow_at_point_avx2;
  }
  aom_compute_mean_stddev = aom_compute_mean_stddev_c;
  if ((uVar1 & 0x20) != 0) {
    aom_compute_mean_stddev = aom_compute_mean_stddev_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_compute_mean_stddev = aom_compute_mean_stddev_avx2;
  }
  aom_convolve8_horiz = aom_convolve8_horiz_c;
  if ((uVar1 & 0x10) != 0) {
    aom_convolve8_horiz = aom_convolve8_horiz_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_convolve8_horiz = aom_convolve8_horiz_avx2;
  }
  aom_convolve8_vert = aom_convolve8_vert_c;
  if ((uVar1 & 0x10) != 0) {
    aom_convolve8_vert = aom_convolve8_vert_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_convolve8_vert = aom_convolve8_vert_avx2;
  }
  aom_convolve_copy = aom_convolve_copy_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_convolve_copy = aom_convolve_copy_avx2;
  }
  aom_dc_128_predictor_32x16 = aom_dc_128_predictor_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_32x16 = aom_dc_128_predictor_32x16_avx2;
  }
  aom_dc_128_predictor_32x32 = aom_dc_128_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_32x32 = aom_dc_128_predictor_32x32_avx2;
  }
  aom_dc_128_predictor_32x64 = aom_dc_128_predictor_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_32x64 = aom_dc_128_predictor_32x64_avx2;
  }
  aom_dc_128_predictor_64x16 = aom_dc_128_predictor_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_64x16 = aom_dc_128_predictor_64x16_avx2;
  }
  aom_dc_128_predictor_64x32 = aom_dc_128_predictor_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_64x32 = aom_dc_128_predictor_64x32_avx2;
  }
  aom_dc_128_predictor_64x64 = aom_dc_128_predictor_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_128_predictor_64x64 = aom_dc_128_predictor_64x64_avx2;
  }
  aom_dc_left_predictor_32x16 = aom_dc_left_predictor_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_32x16 = aom_dc_left_predictor_32x16_avx2;
  }
  aom_dc_left_predictor_32x32 = aom_dc_left_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_32x32 = aom_dc_left_predictor_32x32_avx2;
  }
  aom_dc_left_predictor_32x64 = aom_dc_left_predictor_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_32x64 = aom_dc_left_predictor_32x64_avx2;
  }
  aom_dc_left_predictor_64x16 = aom_dc_left_predictor_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_64x16 = aom_dc_left_predictor_64x16_avx2;
  }
  aom_dc_left_predictor_64x32 = aom_dc_left_predictor_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_64x32 = aom_dc_left_predictor_64x32_avx2;
  }
  aom_dc_left_predictor_64x64 = aom_dc_left_predictor_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_left_predictor_64x64 = aom_dc_left_predictor_64x64_avx2;
  }
  aom_dc_predictor_32x16 = aom_dc_predictor_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_32x16 = aom_dc_predictor_32x16_avx2;
  }
  aom_dc_predictor_32x32 = aom_dc_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_32x32 = aom_dc_predictor_32x32_avx2;
  }
  aom_dc_predictor_32x64 = aom_dc_predictor_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_32x64 = aom_dc_predictor_32x64_avx2;
  }
  aom_dc_predictor_64x16 = aom_dc_predictor_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_64x16 = aom_dc_predictor_64x16_avx2;
  }
  aom_dc_predictor_64x32 = aom_dc_predictor_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_64x32 = aom_dc_predictor_64x32_avx2;
  }
  aom_dc_predictor_64x64 = aom_dc_predictor_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_predictor_64x64 = aom_dc_predictor_64x64_avx2;
  }
  aom_dc_top_predictor_32x16 = aom_dc_top_predictor_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_32x16 = aom_dc_top_predictor_32x16_avx2;
  }
  aom_dc_top_predictor_32x32 = aom_dc_top_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_32x32 = aom_dc_top_predictor_32x32_avx2;
  }
  aom_dc_top_predictor_32x64 = aom_dc_top_predictor_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_32x64 = aom_dc_top_predictor_32x64_avx2;
  }
  aom_dc_top_predictor_64x16 = aom_dc_top_predictor_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_64x16 = aom_dc_top_predictor_64x16_avx2;
  }
  aom_dc_top_predictor_64x32 = aom_dc_top_predictor_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_64x32 = aom_dc_top_predictor_64x32_avx2;
  }
  aom_dc_top_predictor_64x64 = aom_dc_top_predictor_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_dc_top_predictor_64x64 = aom_dc_top_predictor_64x64_avx2;
  }
  aom_fft16x16_float = aom_fft16x16_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_fft16x16_float = aom_fft16x16_float_avx2;
  }
  aom_fft32x32_float = aom_fft32x32_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_fft32x32_float = aom_fft32x32_float_avx2;
  }
  aom_fft8x8_float = aom_fft8x8_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_fft8x8_float = aom_fft8x8_float_avx2;
  }
  aom_get_blk_sse_sum = aom_get_blk_sse_sum_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_get_blk_sse_sum = aom_get_blk_sse_sum_avx2;
  }
  aom_get_var_sse_sum_16x16_dual = aom_get_var_sse_sum_16x16_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_get_var_sse_sum_16x16_dual = aom_get_var_sse_sum_16x16_dual_avx2;
  }
  aom_get_var_sse_sum_8x8_quad = aom_get_var_sse_sum_8x8_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_get_var_sse_sum_8x8_quad = aom_get_var_sse_sum_8x8_quad_avx2;
  }
  aom_h_predictor_32x32 = aom_h_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_h_predictor_32x32 = aom_h_predictor_32x32_avx2;
  }
  aom_hadamard_16x16 = aom_hadamard_16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_hadamard_16x16 = aom_hadamard_16x16_avx2;
  }
  aom_hadamard_32x32 = aom_hadamard_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_hadamard_32x32 = aom_hadamard_32x32_avx2;
  }
  aom_hadamard_lp_16x16 = aom_hadamard_lp_16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_hadamard_lp_16x16 = aom_hadamard_lp_16x16_avx2;
  }
  aom_hadamard_lp_8x8_dual = aom_hadamard_lp_8x8_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_hadamard_lp_8x8_dual = aom_hadamard_lp_8x8_dual_avx2;
  }
  aom_highbd_10_masked_sub_pixel_variance128x128 = aom_highbd_10_masked_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance128x128 =
         aom_highbd_10_masked_sub_pixel_variance128x128_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance128x64 = aom_highbd_10_masked_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance128x64 =
         aom_highbd_10_masked_sub_pixel_variance128x64_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance16x16 = aom_highbd_10_masked_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance16x16 =
         aom_highbd_10_masked_sub_pixel_variance16x16_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance16x32 = aom_highbd_10_masked_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance16x32 =
         aom_highbd_10_masked_sub_pixel_variance16x32_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance16x4 = aom_highbd_10_masked_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance16x4 = aom_highbd_10_masked_sub_pixel_variance16x4_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance16x64 = aom_highbd_10_masked_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance16x64 =
         aom_highbd_10_masked_sub_pixel_variance16x64_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance16x8 = aom_highbd_10_masked_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance16x8 = aom_highbd_10_masked_sub_pixel_variance16x8_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance32x16 = aom_highbd_10_masked_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance32x16 =
         aom_highbd_10_masked_sub_pixel_variance32x16_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance32x32 = aom_highbd_10_masked_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance32x32 =
         aom_highbd_10_masked_sub_pixel_variance32x32_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance32x64 = aom_highbd_10_masked_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance32x64 =
         aom_highbd_10_masked_sub_pixel_variance32x64_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance32x8 = aom_highbd_10_masked_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance32x8 = aom_highbd_10_masked_sub_pixel_variance32x8_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance4x16 = aom_highbd_10_masked_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance4x16 = aom_highbd_10_masked_sub_pixel_variance4x16_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance4x4 = aom_highbd_10_masked_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance4x4 = aom_highbd_10_masked_sub_pixel_variance4x4_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance4x8 = aom_highbd_10_masked_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance4x8 = aom_highbd_10_masked_sub_pixel_variance4x8_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance64x128 = aom_highbd_10_masked_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance64x128 =
         aom_highbd_10_masked_sub_pixel_variance64x128_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance64x16 = aom_highbd_10_masked_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance64x16 =
         aom_highbd_10_masked_sub_pixel_variance64x16_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance64x32 = aom_highbd_10_masked_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance64x32 =
         aom_highbd_10_masked_sub_pixel_variance64x32_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance64x64 = aom_highbd_10_masked_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance64x64 =
         aom_highbd_10_masked_sub_pixel_variance64x64_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance8x16 = aom_highbd_10_masked_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance8x16 = aom_highbd_10_masked_sub_pixel_variance8x16_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance8x32 = aom_highbd_10_masked_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance8x32 = aom_highbd_10_masked_sub_pixel_variance8x32_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance8x4 = aom_highbd_10_masked_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance8x4 = aom_highbd_10_masked_sub_pixel_variance8x4_ssse3;
  }
  aom_highbd_10_masked_sub_pixel_variance8x8 = aom_highbd_10_masked_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_10_masked_sub_pixel_variance8x8 = aom_highbd_10_masked_sub_pixel_variance8x8_ssse3;
  }
  aom_highbd_10_mse16x16 = aom_highbd_10_mse16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_mse16x16 = aom_highbd_10_mse16x16_avx2;
  }
  aom_highbd_10_obmc_variance128x128 = aom_highbd_10_obmc_variance128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance128x128 = aom_highbd_10_obmc_variance128x128_sse4_1;
  }
  aom_highbd_10_obmc_variance128x64 = aom_highbd_10_obmc_variance128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance128x64 = aom_highbd_10_obmc_variance128x64_sse4_1;
  }
  aom_highbd_10_obmc_variance16x16 = aom_highbd_10_obmc_variance16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance16x16 = aom_highbd_10_obmc_variance16x16_sse4_1;
  }
  aom_highbd_10_obmc_variance16x32 = aom_highbd_10_obmc_variance16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance16x32 = aom_highbd_10_obmc_variance16x32_sse4_1;
  }
  aom_highbd_10_obmc_variance16x4 = aom_highbd_10_obmc_variance16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance16x4 = aom_highbd_10_obmc_variance16x4_sse4_1;
  }
  aom_highbd_10_obmc_variance16x64 = aom_highbd_10_obmc_variance16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance16x64 = aom_highbd_10_obmc_variance16x64_sse4_1;
  }
  aom_highbd_10_obmc_variance16x8 = aom_highbd_10_obmc_variance16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance16x8 = aom_highbd_10_obmc_variance16x8_sse4_1;
  }
  aom_highbd_10_obmc_variance32x16 = aom_highbd_10_obmc_variance32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance32x16 = aom_highbd_10_obmc_variance32x16_sse4_1;
  }
  aom_highbd_10_obmc_variance32x32 = aom_highbd_10_obmc_variance32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance32x32 = aom_highbd_10_obmc_variance32x32_sse4_1;
  }
  aom_highbd_10_obmc_variance32x64 = aom_highbd_10_obmc_variance32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance32x64 = aom_highbd_10_obmc_variance32x64_sse4_1;
  }
  aom_highbd_10_obmc_variance32x8 = aom_highbd_10_obmc_variance32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance32x8 = aom_highbd_10_obmc_variance32x8_sse4_1;
  }
  aom_highbd_10_obmc_variance4x16 = aom_highbd_10_obmc_variance4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance4x16 = aom_highbd_10_obmc_variance4x16_sse4_1;
  }
  aom_highbd_10_obmc_variance4x4 = aom_highbd_10_obmc_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance4x4 = aom_highbd_10_obmc_variance4x4_sse4_1;
  }
  aom_highbd_10_obmc_variance4x8 = aom_highbd_10_obmc_variance4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance4x8 = aom_highbd_10_obmc_variance4x8_sse4_1;
  }
  aom_highbd_10_obmc_variance64x128 = aom_highbd_10_obmc_variance64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance64x128 = aom_highbd_10_obmc_variance64x128_sse4_1;
  }
  aom_highbd_10_obmc_variance64x16 = aom_highbd_10_obmc_variance64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance64x16 = aom_highbd_10_obmc_variance64x16_sse4_1;
  }
  aom_highbd_10_obmc_variance64x32 = aom_highbd_10_obmc_variance64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance64x32 = aom_highbd_10_obmc_variance64x32_sse4_1;
  }
  aom_highbd_10_obmc_variance64x64 = aom_highbd_10_obmc_variance64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance64x64 = aom_highbd_10_obmc_variance64x64_sse4_1;
  }
  aom_highbd_10_obmc_variance8x16 = aom_highbd_10_obmc_variance8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance8x16 = aom_highbd_10_obmc_variance8x16_sse4_1;
  }
  aom_highbd_10_obmc_variance8x32 = aom_highbd_10_obmc_variance8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance8x32 = aom_highbd_10_obmc_variance8x32_sse4_1;
  }
  aom_highbd_10_obmc_variance8x4 = aom_highbd_10_obmc_variance8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance8x4 = aom_highbd_10_obmc_variance8x4_sse4_1;
  }
  aom_highbd_10_obmc_variance8x8 = aom_highbd_10_obmc_variance8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_obmc_variance8x8 = aom_highbd_10_obmc_variance8x8_sse4_1;
  }
  aom_highbd_10_sub_pixel_avg_variance4x4 = aom_highbd_10_sub_pixel_avg_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_sub_pixel_avg_variance4x4 = aom_highbd_10_sub_pixel_avg_variance4x4_sse4_1;
  }
  aom_highbd_10_sub_pixel_variance128x128 = aom_highbd_10_sub_pixel_variance128x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance128x128 = aom_highbd_10_sub_pixel_variance128x128_avx2;
  }
  aom_highbd_10_sub_pixel_variance128x64 = aom_highbd_10_sub_pixel_variance128x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance128x64 = aom_highbd_10_sub_pixel_variance128x64_avx2;
  }
  aom_highbd_10_sub_pixel_variance16x16 = aom_highbd_10_sub_pixel_variance16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance16x16 = aom_highbd_10_sub_pixel_variance16x16_avx2;
  }
  aom_highbd_10_sub_pixel_variance16x32 = aom_highbd_10_sub_pixel_variance16x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance16x32 = aom_highbd_10_sub_pixel_variance16x32_avx2;
  }
  aom_highbd_10_sub_pixel_variance16x8 = aom_highbd_10_sub_pixel_variance16x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance16x8 = aom_highbd_10_sub_pixel_variance16x8_avx2;
  }
  aom_highbd_10_sub_pixel_variance32x16 = aom_highbd_10_sub_pixel_variance32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance32x16 = aom_highbd_10_sub_pixel_variance32x16_avx2;
  }
  aom_highbd_10_sub_pixel_variance32x32 = aom_highbd_10_sub_pixel_variance32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance32x32 = aom_highbd_10_sub_pixel_variance32x32_avx2;
  }
  aom_highbd_10_sub_pixel_variance32x64 = aom_highbd_10_sub_pixel_variance32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance32x64 = aom_highbd_10_sub_pixel_variance32x64_avx2;
  }
  aom_highbd_10_sub_pixel_variance4x4 = aom_highbd_10_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_sub_pixel_variance4x4 = aom_highbd_10_sub_pixel_variance4x4_sse4_1;
  }
  aom_highbd_10_sub_pixel_variance64x128 = aom_highbd_10_sub_pixel_variance64x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance64x128 = aom_highbd_10_sub_pixel_variance64x128_avx2;
  }
  aom_highbd_10_sub_pixel_variance64x32 = aom_highbd_10_sub_pixel_variance64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance64x32 = aom_highbd_10_sub_pixel_variance64x32_avx2;
  }
  aom_highbd_10_sub_pixel_variance64x64 = aom_highbd_10_sub_pixel_variance64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance64x64 = aom_highbd_10_sub_pixel_variance64x64_avx2;
  }
  aom_highbd_10_sub_pixel_variance8x16 = aom_highbd_10_sub_pixel_variance8x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance8x16 = aom_highbd_10_sub_pixel_variance8x16_avx2;
  }
  aom_highbd_10_sub_pixel_variance8x8 = aom_highbd_10_sub_pixel_variance8x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_sub_pixel_variance8x8 = aom_highbd_10_sub_pixel_variance8x8_avx2;
  }
  aom_highbd_10_variance128x128 = aom_highbd_10_variance128x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance128x128 = aom_highbd_10_variance128x128_avx2;
  }
  aom_highbd_10_variance128x64 = aom_highbd_10_variance128x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance128x64 = aom_highbd_10_variance128x64_avx2;
  }
  aom_highbd_10_variance16x16 = aom_highbd_10_variance16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance16x16 = aom_highbd_10_variance16x16_avx2;
  }
  aom_highbd_10_variance16x32 = aom_highbd_10_variance16x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance16x32 = aom_highbd_10_variance16x32_avx2;
  }
  aom_highbd_10_variance16x64 = aom_highbd_10_variance16x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance16x64 = aom_highbd_10_variance16x64_avx2;
  }
  aom_highbd_10_variance16x8 = aom_highbd_10_variance16x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance16x8 = aom_highbd_10_variance16x8_avx2;
  }
  aom_highbd_10_variance32x16 = aom_highbd_10_variance32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance32x16 = aom_highbd_10_variance32x16_avx2;
  }
  aom_highbd_10_variance32x32 = aom_highbd_10_variance32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance32x32 = aom_highbd_10_variance32x32_avx2;
  }
  aom_highbd_10_variance32x64 = aom_highbd_10_variance32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance32x64 = aom_highbd_10_variance32x64_avx2;
  }
  aom_highbd_10_variance32x8 = aom_highbd_10_variance32x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance32x8 = aom_highbd_10_variance32x8_avx2;
  }
  aom_highbd_10_variance4x4 = aom_highbd_10_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_10_variance4x4 = aom_highbd_10_variance4x4_sse4_1;
  }
  aom_highbd_10_variance64x128 = aom_highbd_10_variance64x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance64x128 = aom_highbd_10_variance64x128_avx2;
  }
  aom_highbd_10_variance64x16 = aom_highbd_10_variance64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance64x16 = aom_highbd_10_variance64x16_avx2;
  }
  aom_highbd_10_variance64x32 = aom_highbd_10_variance64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance64x32 = aom_highbd_10_variance64x32_avx2;
  }
  aom_highbd_10_variance64x64 = aom_highbd_10_variance64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance64x64 = aom_highbd_10_variance64x64_avx2;
  }
  aom_highbd_10_variance8x16 = aom_highbd_10_variance8x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance8x16 = aom_highbd_10_variance8x16_avx2;
  }
  aom_highbd_10_variance8x32 = aom_highbd_10_variance8x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance8x32 = aom_highbd_10_variance8x32_avx2;
  }
  aom_highbd_10_variance8x8 = aom_highbd_10_variance8x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_10_variance8x8 = aom_highbd_10_variance8x8_avx2;
  }
  aom_highbd_12_masked_sub_pixel_variance128x128 = aom_highbd_12_masked_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance128x128 =
         aom_highbd_12_masked_sub_pixel_variance128x128_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance128x64 = aom_highbd_12_masked_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance128x64 =
         aom_highbd_12_masked_sub_pixel_variance128x64_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance16x16 = aom_highbd_12_masked_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance16x16 =
         aom_highbd_12_masked_sub_pixel_variance16x16_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance16x32 = aom_highbd_12_masked_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance16x32 =
         aom_highbd_12_masked_sub_pixel_variance16x32_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance16x4 = aom_highbd_12_masked_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance16x4 = aom_highbd_12_masked_sub_pixel_variance16x4_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance16x64 = aom_highbd_12_masked_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance16x64 =
         aom_highbd_12_masked_sub_pixel_variance16x64_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance16x8 = aom_highbd_12_masked_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance16x8 = aom_highbd_12_masked_sub_pixel_variance16x8_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance32x16 = aom_highbd_12_masked_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance32x16 =
         aom_highbd_12_masked_sub_pixel_variance32x16_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance32x32 = aom_highbd_12_masked_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance32x32 =
         aom_highbd_12_masked_sub_pixel_variance32x32_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance32x64 = aom_highbd_12_masked_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance32x64 =
         aom_highbd_12_masked_sub_pixel_variance32x64_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance32x8 = aom_highbd_12_masked_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance32x8 = aom_highbd_12_masked_sub_pixel_variance32x8_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance4x16 = aom_highbd_12_masked_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance4x16 = aom_highbd_12_masked_sub_pixel_variance4x16_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance4x4 = aom_highbd_12_masked_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance4x4 = aom_highbd_12_masked_sub_pixel_variance4x4_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance4x8 = aom_highbd_12_masked_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance4x8 = aom_highbd_12_masked_sub_pixel_variance4x8_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance64x128 = aom_highbd_12_masked_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance64x128 =
         aom_highbd_12_masked_sub_pixel_variance64x128_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance64x16 = aom_highbd_12_masked_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance64x16 =
         aom_highbd_12_masked_sub_pixel_variance64x16_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance64x32 = aom_highbd_12_masked_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance64x32 =
         aom_highbd_12_masked_sub_pixel_variance64x32_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance64x64 = aom_highbd_12_masked_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance64x64 =
         aom_highbd_12_masked_sub_pixel_variance64x64_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance8x16 = aom_highbd_12_masked_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance8x16 = aom_highbd_12_masked_sub_pixel_variance8x16_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance8x32 = aom_highbd_12_masked_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance8x32 = aom_highbd_12_masked_sub_pixel_variance8x32_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance8x4 = aom_highbd_12_masked_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance8x4 = aom_highbd_12_masked_sub_pixel_variance8x4_ssse3;
  }
  aom_highbd_12_masked_sub_pixel_variance8x8 = aom_highbd_12_masked_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_12_masked_sub_pixel_variance8x8 = aom_highbd_12_masked_sub_pixel_variance8x8_ssse3;
  }
  aom_highbd_12_obmc_variance128x128 = aom_highbd_12_obmc_variance128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance128x128 = aom_highbd_12_obmc_variance128x128_sse4_1;
  }
  aom_highbd_12_obmc_variance128x64 = aom_highbd_12_obmc_variance128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance128x64 = aom_highbd_12_obmc_variance128x64_sse4_1;
  }
  aom_highbd_12_obmc_variance16x16 = aom_highbd_12_obmc_variance16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance16x16 = aom_highbd_12_obmc_variance16x16_sse4_1;
  }
  aom_highbd_12_obmc_variance16x32 = aom_highbd_12_obmc_variance16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance16x32 = aom_highbd_12_obmc_variance16x32_sse4_1;
  }
  aom_highbd_12_obmc_variance16x4 = aom_highbd_12_obmc_variance16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance16x4 = aom_highbd_12_obmc_variance16x4_sse4_1;
  }
  aom_highbd_12_obmc_variance16x64 = aom_highbd_12_obmc_variance16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance16x64 = aom_highbd_12_obmc_variance16x64_sse4_1;
  }
  aom_highbd_12_obmc_variance16x8 = aom_highbd_12_obmc_variance16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance16x8 = aom_highbd_12_obmc_variance16x8_sse4_1;
  }
  aom_highbd_12_obmc_variance32x16 = aom_highbd_12_obmc_variance32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance32x16 = aom_highbd_12_obmc_variance32x16_sse4_1;
  }
  aom_highbd_12_obmc_variance32x32 = aom_highbd_12_obmc_variance32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance32x32 = aom_highbd_12_obmc_variance32x32_sse4_1;
  }
  aom_highbd_12_obmc_variance32x64 = aom_highbd_12_obmc_variance32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance32x64 = aom_highbd_12_obmc_variance32x64_sse4_1;
  }
  aom_highbd_12_obmc_variance32x8 = aom_highbd_12_obmc_variance32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance32x8 = aom_highbd_12_obmc_variance32x8_sse4_1;
  }
  aom_highbd_12_obmc_variance4x16 = aom_highbd_12_obmc_variance4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance4x16 = aom_highbd_12_obmc_variance4x16_sse4_1;
  }
  aom_highbd_12_obmc_variance4x4 = aom_highbd_12_obmc_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance4x4 = aom_highbd_12_obmc_variance4x4_sse4_1;
  }
  aom_highbd_12_obmc_variance4x8 = aom_highbd_12_obmc_variance4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance4x8 = aom_highbd_12_obmc_variance4x8_sse4_1;
  }
  aom_highbd_12_obmc_variance64x128 = aom_highbd_12_obmc_variance64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance64x128 = aom_highbd_12_obmc_variance64x128_sse4_1;
  }
  aom_highbd_12_obmc_variance64x16 = aom_highbd_12_obmc_variance64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance64x16 = aom_highbd_12_obmc_variance64x16_sse4_1;
  }
  aom_highbd_12_obmc_variance64x32 = aom_highbd_12_obmc_variance64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance64x32 = aom_highbd_12_obmc_variance64x32_sse4_1;
  }
  aom_highbd_12_obmc_variance64x64 = aom_highbd_12_obmc_variance64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance64x64 = aom_highbd_12_obmc_variance64x64_sse4_1;
  }
  aom_highbd_12_obmc_variance8x16 = aom_highbd_12_obmc_variance8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance8x16 = aom_highbd_12_obmc_variance8x16_sse4_1;
  }
  aom_highbd_12_obmc_variance8x32 = aom_highbd_12_obmc_variance8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance8x32 = aom_highbd_12_obmc_variance8x32_sse4_1;
  }
  aom_highbd_12_obmc_variance8x4 = aom_highbd_12_obmc_variance8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance8x4 = aom_highbd_12_obmc_variance8x4_sse4_1;
  }
  aom_highbd_12_obmc_variance8x8 = aom_highbd_12_obmc_variance8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_obmc_variance8x8 = aom_highbd_12_obmc_variance8x8_sse4_1;
  }
  aom_highbd_12_sub_pixel_avg_variance4x4 = aom_highbd_12_sub_pixel_avg_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_sub_pixel_avg_variance4x4 = aom_highbd_12_sub_pixel_avg_variance4x4_sse4_1;
  }
  aom_highbd_12_sub_pixel_variance4x4 = aom_highbd_12_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_sub_pixel_variance4x4 = aom_highbd_12_sub_pixel_variance4x4_sse4_1;
  }
  aom_highbd_12_variance4x4 = aom_highbd_12_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_12_variance4x4 = aom_highbd_12_variance4x4_sse4_1;
  }
  aom_highbd_8_masked_sub_pixel_variance128x128 = aom_highbd_8_masked_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance128x128 =
         aom_highbd_8_masked_sub_pixel_variance128x128_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance128x64 = aom_highbd_8_masked_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance128x64 =
         aom_highbd_8_masked_sub_pixel_variance128x64_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance16x16 = aom_highbd_8_masked_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance16x16 = aom_highbd_8_masked_sub_pixel_variance16x16_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance16x32 = aom_highbd_8_masked_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance16x32 = aom_highbd_8_masked_sub_pixel_variance16x32_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance16x4 = aom_highbd_8_masked_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance16x4 = aom_highbd_8_masked_sub_pixel_variance16x4_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance16x64 = aom_highbd_8_masked_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance16x64 = aom_highbd_8_masked_sub_pixel_variance16x64_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance16x8 = aom_highbd_8_masked_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance16x8 = aom_highbd_8_masked_sub_pixel_variance16x8_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance32x16 = aom_highbd_8_masked_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance32x16 = aom_highbd_8_masked_sub_pixel_variance32x16_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance32x32 = aom_highbd_8_masked_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance32x32 = aom_highbd_8_masked_sub_pixel_variance32x32_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance32x64 = aom_highbd_8_masked_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance32x64 = aom_highbd_8_masked_sub_pixel_variance32x64_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance32x8 = aom_highbd_8_masked_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance32x8 = aom_highbd_8_masked_sub_pixel_variance32x8_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance4x16 = aom_highbd_8_masked_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance4x16 = aom_highbd_8_masked_sub_pixel_variance4x16_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance4x4 = aom_highbd_8_masked_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance4x4 = aom_highbd_8_masked_sub_pixel_variance4x4_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance4x8 = aom_highbd_8_masked_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance4x8 = aom_highbd_8_masked_sub_pixel_variance4x8_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance64x128 = aom_highbd_8_masked_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance64x128 =
         aom_highbd_8_masked_sub_pixel_variance64x128_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance64x16 = aom_highbd_8_masked_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance64x16 = aom_highbd_8_masked_sub_pixel_variance64x16_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance64x32 = aom_highbd_8_masked_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance64x32 = aom_highbd_8_masked_sub_pixel_variance64x32_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance64x64 = aom_highbd_8_masked_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance64x64 = aom_highbd_8_masked_sub_pixel_variance64x64_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance8x16 = aom_highbd_8_masked_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance8x16 = aom_highbd_8_masked_sub_pixel_variance8x16_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance8x32 = aom_highbd_8_masked_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance8x32 = aom_highbd_8_masked_sub_pixel_variance8x32_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance8x4 = aom_highbd_8_masked_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance8x4 = aom_highbd_8_masked_sub_pixel_variance8x4_ssse3;
  }
  aom_highbd_8_masked_sub_pixel_variance8x8 = aom_highbd_8_masked_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_8_masked_sub_pixel_variance8x8 = aom_highbd_8_masked_sub_pixel_variance8x8_ssse3;
  }
  aom_highbd_8_obmc_variance128x128 = aom_highbd_8_obmc_variance128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance128x128 = aom_highbd_8_obmc_variance128x128_sse4_1;
  }
  aom_highbd_8_obmc_variance128x64 = aom_highbd_8_obmc_variance128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance128x64 = aom_highbd_8_obmc_variance128x64_sse4_1;
  }
  aom_highbd_8_obmc_variance16x16 = aom_highbd_8_obmc_variance16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance16x16 = aom_highbd_8_obmc_variance16x16_sse4_1;
  }
  aom_highbd_8_obmc_variance16x32 = aom_highbd_8_obmc_variance16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance16x32 = aom_highbd_8_obmc_variance16x32_sse4_1;
  }
  aom_highbd_8_obmc_variance16x4 = aom_highbd_8_obmc_variance16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance16x4 = aom_highbd_8_obmc_variance16x4_sse4_1;
  }
  aom_highbd_8_obmc_variance16x64 = aom_highbd_8_obmc_variance16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance16x64 = aom_highbd_8_obmc_variance16x64_sse4_1;
  }
  aom_highbd_8_obmc_variance16x8 = aom_highbd_8_obmc_variance16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance16x8 = aom_highbd_8_obmc_variance16x8_sse4_1;
  }
  aom_highbd_8_obmc_variance32x16 = aom_highbd_8_obmc_variance32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance32x16 = aom_highbd_8_obmc_variance32x16_sse4_1;
  }
  aom_highbd_8_obmc_variance32x32 = aom_highbd_8_obmc_variance32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance32x32 = aom_highbd_8_obmc_variance32x32_sse4_1;
  }
  aom_highbd_8_obmc_variance32x64 = aom_highbd_8_obmc_variance32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance32x64 = aom_highbd_8_obmc_variance32x64_sse4_1;
  }
  aom_highbd_8_obmc_variance32x8 = aom_highbd_8_obmc_variance32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance32x8 = aom_highbd_8_obmc_variance32x8_sse4_1;
  }
  aom_highbd_8_obmc_variance4x16 = aom_highbd_8_obmc_variance4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance4x16 = aom_highbd_8_obmc_variance4x16_sse4_1;
  }
  aom_highbd_8_obmc_variance4x4 = aom_highbd_8_obmc_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance4x4 = aom_highbd_8_obmc_variance4x4_sse4_1;
  }
  aom_highbd_8_obmc_variance4x8 = aom_highbd_8_obmc_variance4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance4x8 = aom_highbd_8_obmc_variance4x8_sse4_1;
  }
  aom_highbd_8_obmc_variance64x128 = aom_highbd_8_obmc_variance64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance64x128 = aom_highbd_8_obmc_variance64x128_sse4_1;
  }
  aom_highbd_8_obmc_variance64x16 = aom_highbd_8_obmc_variance64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance64x16 = aom_highbd_8_obmc_variance64x16_sse4_1;
  }
  aom_highbd_8_obmc_variance64x32 = aom_highbd_8_obmc_variance64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance64x32 = aom_highbd_8_obmc_variance64x32_sse4_1;
  }
  aom_highbd_8_obmc_variance64x64 = aom_highbd_8_obmc_variance64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance64x64 = aom_highbd_8_obmc_variance64x64_sse4_1;
  }
  aom_highbd_8_obmc_variance8x16 = aom_highbd_8_obmc_variance8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance8x16 = aom_highbd_8_obmc_variance8x16_sse4_1;
  }
  aom_highbd_8_obmc_variance8x32 = aom_highbd_8_obmc_variance8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance8x32 = aom_highbd_8_obmc_variance8x32_sse4_1;
  }
  aom_highbd_8_obmc_variance8x4 = aom_highbd_8_obmc_variance8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance8x4 = aom_highbd_8_obmc_variance8x4_sse4_1;
  }
  aom_highbd_8_obmc_variance8x8 = aom_highbd_8_obmc_variance8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_obmc_variance8x8 = aom_highbd_8_obmc_variance8x8_sse4_1;
  }
  aom_highbd_8_sub_pixel_avg_variance4x4 = aom_highbd_8_sub_pixel_avg_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_sub_pixel_avg_variance4x4 = aom_highbd_8_sub_pixel_avg_variance4x4_sse4_1;
  }
  aom_highbd_8_sub_pixel_variance4x4 = aom_highbd_8_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_sub_pixel_variance4x4 = aom_highbd_8_sub_pixel_variance4x4_sse4_1;
  }
  aom_highbd_8_variance4x4 = aom_highbd_8_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_8_variance4x4 = aom_highbd_8_variance4x4_sse4_1;
  }
  aom_highbd_blend_a64_d16_mask = aom_highbd_blend_a64_d16_mask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_blend_a64_d16_mask = aom_highbd_blend_a64_d16_mask_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_blend_a64_d16_mask = aom_highbd_blend_a64_d16_mask_avx2;
  }
  aom_highbd_blend_a64_hmask = aom_highbd_blend_a64_hmask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_blend_a64_hmask = aom_highbd_blend_a64_hmask_sse4_1;
  }
  aom_highbd_blend_a64_mask = aom_highbd_blend_a64_mask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_blend_a64_mask = aom_highbd_blend_a64_mask_sse4_1;
  }
  aom_highbd_blend_a64_vmask = aom_highbd_blend_a64_vmask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_blend_a64_vmask = aom_highbd_blend_a64_vmask_sse4_1;
  }
  aom_highbd_comp_mask_pred = aom_highbd_comp_mask_pred_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_comp_mask_pred = aom_highbd_comp_mask_pred_avx2;
  }
  aom_highbd_convolve8_horiz = aom_highbd_convolve8_horiz_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_convolve8_horiz = aom_highbd_convolve8_horiz_avx2;
  }
  aom_highbd_convolve8_vert = aom_highbd_convolve8_vert_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_convolve8_vert = aom_highbd_convolve8_vert_avx2;
  }
  aom_highbd_convolve_copy = aom_highbd_convolve_copy_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_convolve_copy = aom_highbd_convolve_copy_avx2;
  }
  aom_highbd_hadamard_16x16 = aom_highbd_hadamard_16x16_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_hadamard_16x16 = aom_highbd_hadamard_16x16_avx2;
  }
  aom_highbd_hadamard_32x32 = aom_highbd_hadamard_32x32_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_hadamard_32x32 = aom_highbd_hadamard_32x32_avx2;
  }
  aom_highbd_hadamard_8x8 = aom_highbd_hadamard_8x8_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_hadamard_8x8 = aom_highbd_hadamard_8x8_avx2;
  }
  aom_highbd_lpf_horizontal_14_dual = aom_highbd_lpf_horizontal_14_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_horizontal_14_dual = aom_highbd_lpf_horizontal_14_dual_avx2;
  }
  aom_highbd_lpf_horizontal_4_dual = aom_highbd_lpf_horizontal_4_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_horizontal_4_dual = aom_highbd_lpf_horizontal_4_dual_avx2;
  }
  aom_highbd_lpf_horizontal_8_dual = aom_highbd_lpf_horizontal_8_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_horizontal_8_dual = aom_highbd_lpf_horizontal_8_dual_avx2;
  }
  aom_highbd_lpf_vertical_14_dual = aom_highbd_lpf_vertical_14_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_vertical_14_dual = aom_highbd_lpf_vertical_14_dual_avx2;
  }
  aom_highbd_lpf_vertical_4_dual = aom_highbd_lpf_vertical_4_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_vertical_4_dual = aom_highbd_lpf_vertical_4_dual_avx2;
  }
  aom_highbd_lpf_vertical_8_dual = aom_highbd_lpf_vertical_8_dual_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_lpf_vertical_8_dual = aom_highbd_lpf_vertical_8_dual_avx2;
  }
  aom_highbd_masked_sad128x128 = aom_highbd_masked_sad128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad128x128 = aom_highbd_masked_sad128x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad128x128 = aom_highbd_masked_sad128x128_avx2;
  }
  aom_highbd_masked_sad128x64 = aom_highbd_masked_sad128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad128x64 = aom_highbd_masked_sad128x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad128x64 = aom_highbd_masked_sad128x64_avx2;
  }
  aom_highbd_masked_sad16x16 = aom_highbd_masked_sad16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad16x16 = aom_highbd_masked_sad16x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad16x16 = aom_highbd_masked_sad16x16_avx2;
  }
  aom_highbd_masked_sad16x32 = aom_highbd_masked_sad16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad16x32 = aom_highbd_masked_sad16x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad16x32 = aom_highbd_masked_sad16x32_avx2;
  }
  aom_highbd_masked_sad16x4 = aom_highbd_masked_sad16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad16x4 = aom_highbd_masked_sad16x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad16x4 = aom_highbd_masked_sad16x4_avx2;
  }
  aom_highbd_masked_sad16x64 = aom_highbd_masked_sad16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad16x64 = aom_highbd_masked_sad16x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad16x64 = aom_highbd_masked_sad16x64_avx2;
  }
  aom_highbd_masked_sad16x8 = aom_highbd_masked_sad16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad16x8 = aom_highbd_masked_sad16x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad16x8 = aom_highbd_masked_sad16x8_avx2;
  }
  aom_highbd_masked_sad32x16 = aom_highbd_masked_sad32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad32x16 = aom_highbd_masked_sad32x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad32x16 = aom_highbd_masked_sad32x16_avx2;
  }
  aom_highbd_masked_sad32x32 = aom_highbd_masked_sad32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad32x32 = aom_highbd_masked_sad32x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad32x32 = aom_highbd_masked_sad32x32_avx2;
  }
  aom_highbd_masked_sad32x64 = aom_highbd_masked_sad32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad32x64 = aom_highbd_masked_sad32x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad32x64 = aom_highbd_masked_sad32x64_avx2;
  }
  aom_highbd_masked_sad32x8 = aom_highbd_masked_sad32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad32x8 = aom_highbd_masked_sad32x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad32x8 = aom_highbd_masked_sad32x8_avx2;
  }
  aom_highbd_masked_sad4x16 = aom_highbd_masked_sad4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad4x16 = aom_highbd_masked_sad4x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad4x16 = aom_highbd_masked_sad4x16_avx2;
  }
  aom_highbd_masked_sad4x4 = aom_highbd_masked_sad4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad4x4 = aom_highbd_masked_sad4x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad4x4 = aom_highbd_masked_sad4x4_avx2;
  }
  aom_highbd_masked_sad4x8 = aom_highbd_masked_sad4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad4x8 = aom_highbd_masked_sad4x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad4x8 = aom_highbd_masked_sad4x8_avx2;
  }
  aom_highbd_masked_sad64x128 = aom_highbd_masked_sad64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad64x128 = aom_highbd_masked_sad64x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad64x128 = aom_highbd_masked_sad64x128_avx2;
  }
  aom_highbd_masked_sad64x16 = aom_highbd_masked_sad64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad64x16 = aom_highbd_masked_sad64x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad64x16 = aom_highbd_masked_sad64x16_avx2;
  }
  aom_highbd_masked_sad64x32 = aom_highbd_masked_sad64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad64x32 = aom_highbd_masked_sad64x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad64x32 = aom_highbd_masked_sad64x32_avx2;
  }
  aom_highbd_masked_sad64x64 = aom_highbd_masked_sad64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad64x64 = aom_highbd_masked_sad64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad64x64 = aom_highbd_masked_sad64x64_avx2;
  }
  aom_highbd_masked_sad8x16 = aom_highbd_masked_sad8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad8x16 = aom_highbd_masked_sad8x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad8x16 = aom_highbd_masked_sad8x16_avx2;
  }
  aom_highbd_masked_sad8x32 = aom_highbd_masked_sad8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad8x32 = aom_highbd_masked_sad8x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad8x32 = aom_highbd_masked_sad8x32_avx2;
  }
  aom_highbd_masked_sad8x4 = aom_highbd_masked_sad8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad8x4 = aom_highbd_masked_sad8x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad8x4 = aom_highbd_masked_sad8x4_avx2;
  }
  aom_highbd_masked_sad8x8 = aom_highbd_masked_sad8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_highbd_masked_sad8x8 = aom_highbd_masked_sad8x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_masked_sad8x8 = aom_highbd_masked_sad8x8_avx2;
  }
  aom_highbd_obmc_sad128x128 = aom_highbd_obmc_sad128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad128x128 = aom_highbd_obmc_sad128x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad128x128 = aom_highbd_obmc_sad128x128_avx2;
  }
  aom_highbd_obmc_sad128x64 = aom_highbd_obmc_sad128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad128x64 = aom_highbd_obmc_sad128x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad128x64 = aom_highbd_obmc_sad128x64_avx2;
  }
  aom_highbd_obmc_sad16x16 = aom_highbd_obmc_sad16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad16x16 = aom_highbd_obmc_sad16x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad16x16 = aom_highbd_obmc_sad16x16_avx2;
  }
  aom_highbd_obmc_sad16x32 = aom_highbd_obmc_sad16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad16x32 = aom_highbd_obmc_sad16x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad16x32 = aom_highbd_obmc_sad16x32_avx2;
  }
  aom_highbd_obmc_sad16x4 = aom_highbd_obmc_sad16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad16x4 = aom_highbd_obmc_sad16x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad16x4 = aom_highbd_obmc_sad16x4_avx2;
  }
  aom_highbd_obmc_sad16x64 = aom_highbd_obmc_sad16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad16x64 = aom_highbd_obmc_sad16x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad16x64 = aom_highbd_obmc_sad16x64_avx2;
  }
  aom_highbd_obmc_sad16x8 = aom_highbd_obmc_sad16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad16x8 = aom_highbd_obmc_sad16x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad16x8 = aom_highbd_obmc_sad16x8_avx2;
  }
  aom_highbd_obmc_sad32x16 = aom_highbd_obmc_sad32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad32x16 = aom_highbd_obmc_sad32x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad32x16 = aom_highbd_obmc_sad32x16_avx2;
  }
  aom_highbd_obmc_sad32x32 = aom_highbd_obmc_sad32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad32x32 = aom_highbd_obmc_sad32x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad32x32 = aom_highbd_obmc_sad32x32_avx2;
  }
  aom_highbd_obmc_sad32x64 = aom_highbd_obmc_sad32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad32x64 = aom_highbd_obmc_sad32x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad32x64 = aom_highbd_obmc_sad32x64_avx2;
  }
  aom_highbd_obmc_sad32x8 = aom_highbd_obmc_sad32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad32x8 = aom_highbd_obmc_sad32x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad32x8 = aom_highbd_obmc_sad32x8_avx2;
  }
  aom_highbd_obmc_sad4x16 = aom_highbd_obmc_sad4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad4x16 = aom_highbd_obmc_sad4x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad4x16 = aom_highbd_obmc_sad4x16_avx2;
  }
  aom_highbd_obmc_sad4x4 = aom_highbd_obmc_sad4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad4x4 = aom_highbd_obmc_sad4x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad4x4 = aom_highbd_obmc_sad4x4_avx2;
  }
  aom_highbd_obmc_sad4x8 = aom_highbd_obmc_sad4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad4x8 = aom_highbd_obmc_sad4x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad4x8 = aom_highbd_obmc_sad4x8_avx2;
  }
  aom_highbd_obmc_sad64x128 = aom_highbd_obmc_sad64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad64x128 = aom_highbd_obmc_sad64x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad64x128 = aom_highbd_obmc_sad64x128_avx2;
  }
  aom_highbd_obmc_sad64x16 = aom_highbd_obmc_sad64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad64x16 = aom_highbd_obmc_sad64x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad64x16 = aom_highbd_obmc_sad64x16_avx2;
  }
  aom_highbd_obmc_sad64x32 = aom_highbd_obmc_sad64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad64x32 = aom_highbd_obmc_sad64x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad64x32 = aom_highbd_obmc_sad64x32_avx2;
  }
  aom_highbd_obmc_sad64x64 = aom_highbd_obmc_sad64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad64x64 = aom_highbd_obmc_sad64x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad64x64 = aom_highbd_obmc_sad64x64_avx2;
  }
  aom_highbd_obmc_sad8x16 = aom_highbd_obmc_sad8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad8x16 = aom_highbd_obmc_sad8x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad8x16 = aom_highbd_obmc_sad8x16_avx2;
  }
  aom_highbd_obmc_sad8x32 = aom_highbd_obmc_sad8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad8x32 = aom_highbd_obmc_sad8x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad8x32 = aom_highbd_obmc_sad8x32_avx2;
  }
  aom_highbd_obmc_sad8x4 = aom_highbd_obmc_sad8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad8x4 = aom_highbd_obmc_sad8x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad8x4 = aom_highbd_obmc_sad8x4_avx2;
  }
  aom_highbd_obmc_sad8x8 = aom_highbd_obmc_sad8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_obmc_sad8x8 = aom_highbd_obmc_sad8x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_obmc_sad8x8 = aom_highbd_obmc_sad8x8_avx2;
  }
  aom_highbd_quantize_b = aom_highbd_quantize_b_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_quantize_b = aom_highbd_quantize_b_avx2;
  }
  aom_highbd_quantize_b_32x32 = aom_highbd_quantize_b_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_quantize_b_32x32 = aom_highbd_quantize_b_32x32_avx2;
  }
  aom_highbd_quantize_b_32x32_adaptive = aom_highbd_quantize_b_32x32_adaptive_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_quantize_b_32x32_adaptive = aom_highbd_quantize_b_32x32_adaptive_avx2;
  }
  aom_highbd_quantize_b_64x64 = aom_highbd_quantize_b_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_quantize_b_64x64 = aom_highbd_quantize_b_64x64_avx2;
  }
  aom_highbd_quantize_b_adaptive = aom_highbd_quantize_b_adaptive_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_quantize_b_adaptive = aom_highbd_quantize_b_adaptive_avx2;
  }
  aom_highbd_sad128x128 = aom_highbd_sad128x128_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x128 = aom_highbd_sad128x128_avx2;
  }
  aom_highbd_sad128x128_avg = aom_highbd_sad128x128_avg_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x128_avg = aom_highbd_sad128x128_avg_avx2;
  }
  aom_highbd_sad128x128x3d = aom_highbd_sad128x128x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x128x3d = aom_highbd_sad128x128x3d_avx2;
  }
  aom_highbd_sad128x128x4d = aom_highbd_sad128x128x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x128x4d = aom_highbd_sad128x128x4d_avx2;
  }
  aom_highbd_sad128x64 = aom_highbd_sad128x64_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x64 = aom_highbd_sad128x64_avx2;
  }
  aom_highbd_sad128x64_avg = aom_highbd_sad128x64_avg_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x64_avg = aom_highbd_sad128x64_avg_avx2;
  }
  aom_highbd_sad128x64x3d = aom_highbd_sad128x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x64x3d = aom_highbd_sad128x64x3d_avx2;
  }
  aom_highbd_sad128x64x4d = aom_highbd_sad128x64x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad128x64x4d = aom_highbd_sad128x64x4d_avx2;
  }
  aom_highbd_sad16x16 = aom_highbd_sad16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x16 = aom_highbd_sad16x16_avx2;
  }
  aom_highbd_sad16x16_avg = aom_highbd_sad16x16_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x16_avg = aom_highbd_sad16x16_avg_avx2;
  }
  aom_highbd_sad16x16x3d = aom_highbd_sad16x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x16x3d = aom_highbd_sad16x16x3d_avx2;
  }
  aom_highbd_sad16x16x4d = aom_highbd_sad16x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x16x4d = aom_highbd_sad16x16x4d_avx2;
  }
  aom_highbd_sad16x32 = aom_highbd_sad16x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x32 = aom_highbd_sad16x32_avx2;
  }
  aom_highbd_sad16x32_avg = aom_highbd_sad16x32_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x32_avg = aom_highbd_sad16x32_avg_avx2;
  }
  aom_highbd_sad16x32x3d = aom_highbd_sad16x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x32x3d = aom_highbd_sad16x32x3d_avx2;
  }
  aom_highbd_sad16x32x4d = aom_highbd_sad16x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x32x4d = aom_highbd_sad16x32x4d_avx2;
  }
  aom_highbd_sad16x4 = aom_highbd_sad16x4_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x4 = aom_highbd_sad16x4_avx2;
  }
  aom_highbd_sad16x4x3d = aom_highbd_sad16x4x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x4x3d = aom_highbd_sad16x4x3d_avx2;
  }
  aom_highbd_sad16x4x4d = aom_highbd_sad16x4x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x4x4d = aom_highbd_sad16x4x4d_avx2;
  }
  aom_highbd_sad16x64 = aom_highbd_sad16x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x64 = aom_highbd_sad16x64_avx2;
  }
  aom_highbd_sad16x64_avg = aom_highbd_sad16x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x64_avg = aom_highbd_sad16x64_avg_avx2;
  }
  aom_highbd_sad16x64x3d = aom_highbd_sad16x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x64x3d = aom_highbd_sad16x64x3d_avx2;
  }
  aom_highbd_sad16x64x4d = aom_highbd_sad16x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x64x4d = aom_highbd_sad16x64x4d_avx2;
  }
  aom_highbd_sad16x8 = aom_highbd_sad16x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x8 = aom_highbd_sad16x8_avx2;
  }
  aom_highbd_sad16x8_avg = aom_highbd_sad16x8_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x8_avg = aom_highbd_sad16x8_avg_avx2;
  }
  aom_highbd_sad16x8x3d = aom_highbd_sad16x8x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x8x3d = aom_highbd_sad16x8x3d_avx2;
  }
  aom_highbd_sad16x8x4d = aom_highbd_sad16x8x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad16x8x4d = aom_highbd_sad16x8x4d_avx2;
  }
  aom_highbd_sad32x16 = aom_highbd_sad32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x16 = aom_highbd_sad32x16_avx2;
  }
  aom_highbd_sad32x16_avg = aom_highbd_sad32x16_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x16_avg = aom_highbd_sad32x16_avg_avx2;
  }
  aom_highbd_sad32x16x3d = aom_highbd_sad32x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x16x3d = aom_highbd_sad32x16x3d_avx2;
  }
  aom_highbd_sad32x16x4d = aom_highbd_sad32x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x16x4d = aom_highbd_sad32x16x4d_avx2;
  }
  aom_highbd_sad32x32 = aom_highbd_sad32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x32 = aom_highbd_sad32x32_avx2;
  }
  aom_highbd_sad32x32_avg = aom_highbd_sad32x32_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x32_avg = aom_highbd_sad32x32_avg_avx2;
  }
  aom_highbd_sad32x32x3d = aom_highbd_sad32x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x32x3d = aom_highbd_sad32x32x3d_avx2;
  }
  aom_highbd_sad32x32x4d = aom_highbd_sad32x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x32x4d = aom_highbd_sad32x32x4d_avx2;
  }
  aom_highbd_sad32x64 = aom_highbd_sad32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x64 = aom_highbd_sad32x64_avx2;
  }
  aom_highbd_sad32x64_avg = aom_highbd_sad32x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x64_avg = aom_highbd_sad32x64_avg_avx2;
  }
  aom_highbd_sad32x64x3d = aom_highbd_sad32x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x64x3d = aom_highbd_sad32x64x3d_avx2;
  }
  aom_highbd_sad32x64x4d = aom_highbd_sad32x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x64x4d = aom_highbd_sad32x64x4d_avx2;
  }
  aom_highbd_sad32x8 = aom_highbd_sad32x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x8 = aom_highbd_sad32x8_avx2;
  }
  aom_highbd_sad32x8_avg = aom_highbd_sad32x8_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x8_avg = aom_highbd_sad32x8_avg_avx2;
  }
  aom_highbd_sad32x8x3d = aom_highbd_sad32x8x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x8x3d = aom_highbd_sad32x8x3d_avx2;
  }
  aom_highbd_sad32x8x4d = aom_highbd_sad32x8x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad32x8x4d = aom_highbd_sad32x8x4d_avx2;
  }
  aom_highbd_sad64x128 = aom_highbd_sad64x128_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x128 = aom_highbd_sad64x128_avx2;
  }
  aom_highbd_sad64x128_avg = aom_highbd_sad64x128_avg_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x128_avg = aom_highbd_sad64x128_avg_avx2;
  }
  aom_highbd_sad64x128x3d = aom_highbd_sad64x128x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x128x3d = aom_highbd_sad64x128x3d_avx2;
  }
  aom_highbd_sad64x128x4d = aom_highbd_sad64x128x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x128x4d = aom_highbd_sad64x128x4d_avx2;
  }
  aom_highbd_sad64x16 = aom_highbd_sad64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x16 = aom_highbd_sad64x16_avx2;
  }
  aom_highbd_sad64x16_avg = aom_highbd_sad64x16_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x16_avg = aom_highbd_sad64x16_avg_avx2;
  }
  aom_highbd_sad64x16x3d = aom_highbd_sad64x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x16x3d = aom_highbd_sad64x16x3d_avx2;
  }
  aom_highbd_sad64x16x4d = aom_highbd_sad64x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x16x4d = aom_highbd_sad64x16x4d_avx2;
  }
  aom_highbd_sad64x32 = aom_highbd_sad64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x32 = aom_highbd_sad64x32_avx2;
  }
  aom_highbd_sad64x32_avg = aom_highbd_sad64x32_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x32_avg = aom_highbd_sad64x32_avg_avx2;
  }
  aom_highbd_sad64x32x3d = aom_highbd_sad64x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x32x3d = aom_highbd_sad64x32x3d_avx2;
  }
  aom_highbd_sad64x32x4d = aom_highbd_sad64x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x32x4d = aom_highbd_sad64x32x4d_avx2;
  }
  aom_highbd_sad64x64 = aom_highbd_sad64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x64 = aom_highbd_sad64x64_avx2;
  }
  aom_highbd_sad64x64_avg = aom_highbd_sad64x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x64_avg = aom_highbd_sad64x64_avg_avx2;
  }
  aom_highbd_sad64x64x3d = aom_highbd_sad64x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x64x3d = aom_highbd_sad64x64x3d_avx2;
  }
  aom_highbd_sad64x64x4d = aom_highbd_sad64x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad64x64x4d = aom_highbd_sad64x64x4d_avx2;
  }
  aom_highbd_sad_skip_128x128 = aom_highbd_sad_skip_128x128_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_128x128 = aom_highbd_sad_skip_128x128_avx2;
  }
  aom_highbd_sad_skip_128x128x4d = aom_highbd_sad_skip_128x128x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_128x128x4d = aom_highbd_sad_skip_128x128x4d_avx2;
  }
  aom_highbd_sad_skip_128x64 = aom_highbd_sad_skip_128x64_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_128x64 = aom_highbd_sad_skip_128x64_avx2;
  }
  aom_highbd_sad_skip_128x64x4d = aom_highbd_sad_skip_128x64x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_128x64x4d = aom_highbd_sad_skip_128x64x4d_avx2;
  }
  aom_highbd_sad_skip_16x16 = aom_highbd_sad_skip_16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x16 = aom_highbd_sad_skip_16x16_avx2;
  }
  aom_highbd_sad_skip_16x16x4d = aom_highbd_sad_skip_16x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x16x4d = aom_highbd_sad_skip_16x16x4d_avx2;
  }
  aom_highbd_sad_skip_16x32 = aom_highbd_sad_skip_16x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x32 = aom_highbd_sad_skip_16x32_avx2;
  }
  aom_highbd_sad_skip_16x32x4d = aom_highbd_sad_skip_16x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x32x4d = aom_highbd_sad_skip_16x32x4d_avx2;
  }
  aom_highbd_sad_skip_16x64 = aom_highbd_sad_skip_16x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x64 = aom_highbd_sad_skip_16x64_avx2;
  }
  aom_highbd_sad_skip_16x64x4d = aom_highbd_sad_skip_16x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_16x64x4d = aom_highbd_sad_skip_16x64x4d_avx2;
  }
  aom_highbd_sad_skip_32x16 = aom_highbd_sad_skip_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x16 = aom_highbd_sad_skip_32x16_avx2;
  }
  aom_highbd_sad_skip_32x16x4d = aom_highbd_sad_skip_32x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x16x4d = aom_highbd_sad_skip_32x16x4d_avx2;
  }
  aom_highbd_sad_skip_32x32 = aom_highbd_sad_skip_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x32 = aom_highbd_sad_skip_32x32_avx2;
  }
  aom_highbd_sad_skip_32x32x4d = aom_highbd_sad_skip_32x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x32x4d = aom_highbd_sad_skip_32x32x4d_avx2;
  }
  aom_highbd_sad_skip_32x64 = aom_highbd_sad_skip_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x64 = aom_highbd_sad_skip_32x64_avx2;
  }
  aom_highbd_sad_skip_32x64x4d = aom_highbd_sad_skip_32x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_32x64x4d = aom_highbd_sad_skip_32x64x4d_avx2;
  }
  aom_highbd_sad_skip_64x128 = aom_highbd_sad_skip_64x128_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x128 = aom_highbd_sad_skip_64x128_avx2;
  }
  aom_highbd_sad_skip_64x128x4d = aom_highbd_sad_skip_64x128x4d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x128x4d = aom_highbd_sad_skip_64x128x4d_avx2;
  }
  aom_highbd_sad_skip_64x16 = aom_highbd_sad_skip_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x16 = aom_highbd_sad_skip_64x16_avx2;
  }
  aom_highbd_sad_skip_64x16x4d = aom_highbd_sad_skip_64x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x16x4d = aom_highbd_sad_skip_64x16x4d_avx2;
  }
  aom_highbd_sad_skip_64x32 = aom_highbd_sad_skip_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x32 = aom_highbd_sad_skip_64x32_avx2;
  }
  aom_highbd_sad_skip_64x32x4d = aom_highbd_sad_skip_64x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x32x4d = aom_highbd_sad_skip_64x32x4d_avx2;
  }
  aom_highbd_sad_skip_64x64 = aom_highbd_sad_skip_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x64 = aom_highbd_sad_skip_64x64_avx2;
  }
  aom_highbd_sad_skip_64x64x4d = aom_highbd_sad_skip_64x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sad_skip_64x64x4d = aom_highbd_sad_skip_64x64x4d_avx2;
  }
  aom_highbd_sse = aom_highbd_sse_c;
  if ((uVar1 & 0x20) != 0) {
    aom_highbd_sse = aom_highbd_sse_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_highbd_sse = aom_highbd_sse_avx2;
  }
  aom_ifft16x16_float = aom_ifft16x16_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_ifft16x16_float = aom_ifft16x16_float_avx2;
  }
  aom_ifft32x32_float = aom_ifft32x32_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_ifft32x32_float = aom_ifft32x32_float_avx2;
  }
  aom_ifft8x8_float = aom_ifft8x8_float_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_ifft8x8_float = aom_ifft8x8_float_avx2;
  }
  aom_int_pro_col = aom_int_pro_col_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_int_pro_col = aom_int_pro_col_avx2;
  }
  aom_int_pro_row = aom_int_pro_row_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_int_pro_row = aom_int_pro_row_avx2;
  }
  aom_lowbd_blend_a64_d16_mask = aom_lowbd_blend_a64_d16_mask_c;
  if ((uVar1 & 0x20) != 0) {
    aom_lowbd_blend_a64_d16_mask = aom_lowbd_blend_a64_d16_mask_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_lowbd_blend_a64_d16_mask = aom_lowbd_blend_a64_d16_mask_avx2;
  }
  aom_lpf_horizontal_14_quad = aom_lpf_horizontal_14_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_lpf_horizontal_14_quad = aom_lpf_horizontal_14_quad_avx2;
  }
  aom_lpf_horizontal_6_quad = aom_lpf_horizontal_6_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_lpf_horizontal_6_quad = aom_lpf_horizontal_6_quad_avx2;
  }
  aom_lpf_horizontal_8_quad = aom_lpf_horizontal_8_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_lpf_horizontal_8_quad = aom_lpf_horizontal_8_quad_avx2;
  }
  aom_lpf_vertical_14_quad = aom_lpf_vertical_14_quad_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_lpf_vertical_14_quad = aom_lpf_vertical_14_quad_avx2;
  }
  aom_masked_sad128x128 = aom_masked_sad128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad128x128 = aom_masked_sad128x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad128x128 = aom_masked_sad128x128_avx2;
  }
  aom_masked_sad128x64 = aom_masked_sad128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad128x64 = aom_masked_sad128x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad128x64 = aom_masked_sad128x64_avx2;
  }
  aom_masked_sad16x16 = aom_masked_sad16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad16x16 = aom_masked_sad16x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad16x16 = aom_masked_sad16x16_avx2;
  }
  aom_masked_sad16x32 = aom_masked_sad16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad16x32 = aom_masked_sad16x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad16x32 = aom_masked_sad16x32_avx2;
  }
  aom_masked_sad16x4 = aom_masked_sad16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad16x4 = aom_masked_sad16x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad16x4 = aom_masked_sad16x4_avx2;
  }
  aom_masked_sad16x64 = aom_masked_sad16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad16x64 = aom_masked_sad16x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad16x64 = aom_masked_sad16x64_avx2;
  }
  aom_masked_sad16x8 = aom_masked_sad16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad16x8 = aom_masked_sad16x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad16x8 = aom_masked_sad16x8_avx2;
  }
  aom_masked_sad32x16 = aom_masked_sad32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad32x16 = aom_masked_sad32x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad32x16 = aom_masked_sad32x16_avx2;
  }
  aom_masked_sad32x32 = aom_masked_sad32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad32x32 = aom_masked_sad32x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad32x32 = aom_masked_sad32x32_avx2;
  }
  aom_masked_sad32x64 = aom_masked_sad32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad32x64 = aom_masked_sad32x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad32x64 = aom_masked_sad32x64_avx2;
  }
  aom_masked_sad32x8 = aom_masked_sad32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad32x8 = aom_masked_sad32x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad32x8 = aom_masked_sad32x8_avx2;
  }
  aom_masked_sad4x16 = aom_masked_sad4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad4x16 = aom_masked_sad4x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad4x16 = aom_masked_sad4x16_avx2;
  }
  aom_masked_sad4x4 = aom_masked_sad4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad4x4 = aom_masked_sad4x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad4x4 = aom_masked_sad4x4_avx2;
  }
  aom_masked_sad4x8 = aom_masked_sad4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad4x8 = aom_masked_sad4x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad4x8 = aom_masked_sad4x8_avx2;
  }
  aom_masked_sad64x128 = aom_masked_sad64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad64x128 = aom_masked_sad64x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad64x128 = aom_masked_sad64x128_avx2;
  }
  aom_masked_sad64x16 = aom_masked_sad64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad64x16 = aom_masked_sad64x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad64x16 = aom_masked_sad64x16_avx2;
  }
  aom_masked_sad64x32 = aom_masked_sad64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad64x32 = aom_masked_sad64x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad64x32 = aom_masked_sad64x32_avx2;
  }
  aom_masked_sad64x64 = aom_masked_sad64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad64x64 = aom_masked_sad64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad64x64 = aom_masked_sad64x64_avx2;
  }
  aom_masked_sad8x16 = aom_masked_sad8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad8x16 = aom_masked_sad8x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad8x16 = aom_masked_sad8x16_avx2;
  }
  aom_masked_sad8x32 = aom_masked_sad8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad8x32 = aom_masked_sad8x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad8x32 = aom_masked_sad8x32_avx2;
  }
  aom_masked_sad8x4 = aom_masked_sad8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad8x4 = aom_masked_sad8x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad8x4 = aom_masked_sad8x4_avx2;
  }
  aom_masked_sad8x8 = aom_masked_sad8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sad8x8 = aom_masked_sad8x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_masked_sad8x8 = aom_masked_sad8x8_avx2;
  }
  aom_masked_sub_pixel_variance128x128 = aom_masked_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance128x128 = aom_masked_sub_pixel_variance128x128_ssse3;
  }
  aom_masked_sub_pixel_variance128x64 = aom_masked_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance128x64 = aom_masked_sub_pixel_variance128x64_ssse3;
  }
  aom_masked_sub_pixel_variance16x16 = aom_masked_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance16x16 = aom_masked_sub_pixel_variance16x16_ssse3;
  }
  aom_masked_sub_pixel_variance16x32 = aom_masked_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance16x32 = aom_masked_sub_pixel_variance16x32_ssse3;
  }
  aom_masked_sub_pixel_variance16x4 = aom_masked_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance16x4 = aom_masked_sub_pixel_variance16x4_ssse3;
  }
  aom_masked_sub_pixel_variance16x64 = aom_masked_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance16x64 = aom_masked_sub_pixel_variance16x64_ssse3;
  }
  aom_masked_sub_pixel_variance16x8 = aom_masked_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance16x8 = aom_masked_sub_pixel_variance16x8_ssse3;
  }
  aom_masked_sub_pixel_variance32x16 = aom_masked_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance32x16 = aom_masked_sub_pixel_variance32x16_ssse3;
  }
  aom_masked_sub_pixel_variance32x32 = aom_masked_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance32x32 = aom_masked_sub_pixel_variance32x32_ssse3;
  }
  aom_masked_sub_pixel_variance32x64 = aom_masked_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance32x64 = aom_masked_sub_pixel_variance32x64_ssse3;
  }
  aom_masked_sub_pixel_variance32x8 = aom_masked_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance32x8 = aom_masked_sub_pixel_variance32x8_ssse3;
  }
  aom_masked_sub_pixel_variance4x16 = aom_masked_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance4x16 = aom_masked_sub_pixel_variance4x16_ssse3;
  }
  aom_masked_sub_pixel_variance4x4 = aom_masked_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance4x4 = aom_masked_sub_pixel_variance4x4_ssse3;
  }
  aom_masked_sub_pixel_variance4x8 = aom_masked_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance4x8 = aom_masked_sub_pixel_variance4x8_ssse3;
  }
  aom_masked_sub_pixel_variance64x128 = aom_masked_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance64x128 = aom_masked_sub_pixel_variance64x128_ssse3;
  }
  aom_masked_sub_pixel_variance64x16 = aom_masked_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance64x16 = aom_masked_sub_pixel_variance64x16_ssse3;
  }
  aom_masked_sub_pixel_variance64x32 = aom_masked_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance64x32 = aom_masked_sub_pixel_variance64x32_ssse3;
  }
  aom_masked_sub_pixel_variance64x64 = aom_masked_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance64x64 = aom_masked_sub_pixel_variance64x64_ssse3;
  }
  aom_masked_sub_pixel_variance8x16 = aom_masked_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance8x16 = aom_masked_sub_pixel_variance8x16_ssse3;
  }
  aom_masked_sub_pixel_variance8x32 = aom_masked_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance8x32 = aom_masked_sub_pixel_variance8x32_ssse3;
  }
  aom_masked_sub_pixel_variance8x4 = aom_masked_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance8x4 = aom_masked_sub_pixel_variance8x4_ssse3;
  }
  aom_masked_sub_pixel_variance8x8 = aom_masked_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_masked_sub_pixel_variance8x8 = aom_masked_sub_pixel_variance8x8_ssse3;
  }
  aom_mse16x16 = aom_mse16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_mse16x16 = aom_mse16x16_avx2;
  }
  aom_mse_16xh_16bit = aom_mse_16xh_16bit_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_mse_16xh_16bit = aom_mse_16xh_16bit_avx2;
  }
  aom_mse_wxh_16bit = aom_mse_wxh_16bit_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_mse_wxh_16bit = aom_mse_wxh_16bit_avx2;
  }
  aom_mse_wxh_16bit_highbd = aom_mse_wxh_16bit_highbd_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_mse_wxh_16bit_highbd = aom_mse_wxh_16bit_highbd_avx2;
  }
  aom_obmc_sad128x128 = aom_obmc_sad128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad128x128 = aom_obmc_sad128x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad128x128 = aom_obmc_sad128x128_avx2;
  }
  aom_obmc_sad128x64 = aom_obmc_sad128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad128x64 = aom_obmc_sad128x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad128x64 = aom_obmc_sad128x64_avx2;
  }
  aom_obmc_sad16x16 = aom_obmc_sad16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad16x16 = aom_obmc_sad16x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad16x16 = aom_obmc_sad16x16_avx2;
  }
  aom_obmc_sad16x32 = aom_obmc_sad16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad16x32 = aom_obmc_sad16x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad16x32 = aom_obmc_sad16x32_avx2;
  }
  aom_obmc_sad16x4 = aom_obmc_sad16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad16x4 = aom_obmc_sad16x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad16x4 = aom_obmc_sad16x4_avx2;
  }
  aom_obmc_sad16x64 = aom_obmc_sad16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad16x64 = aom_obmc_sad16x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad16x64 = aom_obmc_sad16x64_avx2;
  }
  aom_obmc_sad16x8 = aom_obmc_sad16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad16x8 = aom_obmc_sad16x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad16x8 = aom_obmc_sad16x8_avx2;
  }
  aom_obmc_sad32x16 = aom_obmc_sad32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad32x16 = aom_obmc_sad32x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad32x16 = aom_obmc_sad32x16_avx2;
  }
  aom_obmc_sad32x32 = aom_obmc_sad32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad32x32 = aom_obmc_sad32x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad32x32 = aom_obmc_sad32x32_avx2;
  }
  aom_obmc_sad32x64 = aom_obmc_sad32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad32x64 = aom_obmc_sad32x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad32x64 = aom_obmc_sad32x64_avx2;
  }
  aom_obmc_sad32x8 = aom_obmc_sad32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad32x8 = aom_obmc_sad32x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad32x8 = aom_obmc_sad32x8_avx2;
  }
  aom_obmc_sad4x16 = aom_obmc_sad4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad4x16 = aom_obmc_sad4x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad4x16 = aom_obmc_sad4x16_avx2;
  }
  aom_obmc_sad4x4 = aom_obmc_sad4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad4x4 = aom_obmc_sad4x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad4x4 = aom_obmc_sad4x4_avx2;
  }
  aom_obmc_sad4x8 = aom_obmc_sad4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad4x8 = aom_obmc_sad4x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad4x8 = aom_obmc_sad4x8_avx2;
  }
  aom_obmc_sad64x128 = aom_obmc_sad64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad64x128 = aom_obmc_sad64x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad64x128 = aom_obmc_sad64x128_avx2;
  }
  aom_obmc_sad64x16 = aom_obmc_sad64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad64x16 = aom_obmc_sad64x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad64x16 = aom_obmc_sad64x16_avx2;
  }
  aom_obmc_sad64x32 = aom_obmc_sad64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad64x32 = aom_obmc_sad64x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad64x32 = aom_obmc_sad64x32_avx2;
  }
  aom_obmc_sad64x64 = aom_obmc_sad64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad64x64 = aom_obmc_sad64x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad64x64 = aom_obmc_sad64x64_avx2;
  }
  aom_obmc_sad8x16 = aom_obmc_sad8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad8x16 = aom_obmc_sad8x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad8x16 = aom_obmc_sad8x16_avx2;
  }
  aom_obmc_sad8x32 = aom_obmc_sad8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad8x32 = aom_obmc_sad8x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad8x32 = aom_obmc_sad8x32_avx2;
  }
  aom_obmc_sad8x4 = aom_obmc_sad8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad8x4 = aom_obmc_sad8x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad8x4 = aom_obmc_sad8x4_avx2;
  }
  aom_obmc_sad8x8 = aom_obmc_sad8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sad8x8 = aom_obmc_sad8x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_sad8x8 = aom_obmc_sad8x8_avx2;
  }
  aom_obmc_sub_pixel_variance128x128 = aom_obmc_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance128x128 = aom_obmc_sub_pixel_variance128x128_sse4_1;
  }
  aom_obmc_sub_pixel_variance128x64 = aom_obmc_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance128x64 = aom_obmc_sub_pixel_variance128x64_sse4_1;
  }
  aom_obmc_sub_pixel_variance16x16 = aom_obmc_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance16x16 = aom_obmc_sub_pixel_variance16x16_sse4_1;
  }
  aom_obmc_sub_pixel_variance16x32 = aom_obmc_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance16x32 = aom_obmc_sub_pixel_variance16x32_sse4_1;
  }
  aom_obmc_sub_pixel_variance16x4 = aom_obmc_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance16x4 = aom_obmc_sub_pixel_variance16x4_sse4_1;
  }
  aom_obmc_sub_pixel_variance16x64 = aom_obmc_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance16x64 = aom_obmc_sub_pixel_variance16x64_sse4_1;
  }
  aom_obmc_sub_pixel_variance16x8 = aom_obmc_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance16x8 = aom_obmc_sub_pixel_variance16x8_sse4_1;
  }
  aom_obmc_sub_pixel_variance32x16 = aom_obmc_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance32x16 = aom_obmc_sub_pixel_variance32x16_sse4_1;
  }
  aom_obmc_sub_pixel_variance32x32 = aom_obmc_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance32x32 = aom_obmc_sub_pixel_variance32x32_sse4_1;
  }
  aom_obmc_sub_pixel_variance32x64 = aom_obmc_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance32x64 = aom_obmc_sub_pixel_variance32x64_sse4_1;
  }
  aom_obmc_sub_pixel_variance32x8 = aom_obmc_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance32x8 = aom_obmc_sub_pixel_variance32x8_sse4_1;
  }
  aom_obmc_sub_pixel_variance4x16 = aom_obmc_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance4x16 = aom_obmc_sub_pixel_variance4x16_sse4_1;
  }
  aom_obmc_sub_pixel_variance4x4 = aom_obmc_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance4x4 = aom_obmc_sub_pixel_variance4x4_sse4_1;
  }
  aom_obmc_sub_pixel_variance4x8 = aom_obmc_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance4x8 = aom_obmc_sub_pixel_variance4x8_sse4_1;
  }
  aom_obmc_sub_pixel_variance64x128 = aom_obmc_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance64x128 = aom_obmc_sub_pixel_variance64x128_sse4_1;
  }
  aom_obmc_sub_pixel_variance64x16 = aom_obmc_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance64x16 = aom_obmc_sub_pixel_variance64x16_sse4_1;
  }
  aom_obmc_sub_pixel_variance64x32 = aom_obmc_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance64x32 = aom_obmc_sub_pixel_variance64x32_sse4_1;
  }
  aom_obmc_sub_pixel_variance64x64 = aom_obmc_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance64x64 = aom_obmc_sub_pixel_variance64x64_sse4_1;
  }
  aom_obmc_sub_pixel_variance8x16 = aom_obmc_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance8x16 = aom_obmc_sub_pixel_variance8x16_sse4_1;
  }
  aom_obmc_sub_pixel_variance8x32 = aom_obmc_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance8x32 = aom_obmc_sub_pixel_variance8x32_sse4_1;
  }
  aom_obmc_sub_pixel_variance8x4 = aom_obmc_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance8x4 = aom_obmc_sub_pixel_variance8x4_sse4_1;
  }
  aom_obmc_sub_pixel_variance8x8 = aom_obmc_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_sub_pixel_variance8x8 = aom_obmc_sub_pixel_variance8x8_sse4_1;
  }
  aom_obmc_variance128x128 = aom_obmc_variance128x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance128x128 = aom_obmc_variance128x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance128x128 = aom_obmc_variance128x128_avx2;
  }
  aom_obmc_variance128x64 = aom_obmc_variance128x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance128x64 = aom_obmc_variance128x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance128x64 = aom_obmc_variance128x64_avx2;
  }
  aom_obmc_variance16x16 = aom_obmc_variance16x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance16x16 = aom_obmc_variance16x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance16x16 = aom_obmc_variance16x16_avx2;
  }
  aom_obmc_variance16x32 = aom_obmc_variance16x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance16x32 = aom_obmc_variance16x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance16x32 = aom_obmc_variance16x32_avx2;
  }
  aom_obmc_variance16x4 = aom_obmc_variance16x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance16x4 = aom_obmc_variance16x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance16x4 = aom_obmc_variance16x4_avx2;
  }
  aom_obmc_variance16x64 = aom_obmc_variance16x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance16x64 = aom_obmc_variance16x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance16x64 = aom_obmc_variance16x64_avx2;
  }
  aom_obmc_variance16x8 = aom_obmc_variance16x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance16x8 = aom_obmc_variance16x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance16x8 = aom_obmc_variance16x8_avx2;
  }
  aom_obmc_variance32x16 = aom_obmc_variance32x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance32x16 = aom_obmc_variance32x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance32x16 = aom_obmc_variance32x16_avx2;
  }
  aom_obmc_variance32x32 = aom_obmc_variance32x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance32x32 = aom_obmc_variance32x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance32x32 = aom_obmc_variance32x32_avx2;
  }
  aom_obmc_variance32x64 = aom_obmc_variance32x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance32x64 = aom_obmc_variance32x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance32x64 = aom_obmc_variance32x64_avx2;
  }
  aom_obmc_variance32x8 = aom_obmc_variance32x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance32x8 = aom_obmc_variance32x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance32x8 = aom_obmc_variance32x8_avx2;
  }
  aom_obmc_variance4x16 = aom_obmc_variance4x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance4x16 = aom_obmc_variance4x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance4x16 = aom_obmc_variance4x16_avx2;
  }
  aom_obmc_variance4x4 = aom_obmc_variance4x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance4x4 = aom_obmc_variance4x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance4x4 = aom_obmc_variance4x4_avx2;
  }
  aom_obmc_variance4x8 = aom_obmc_variance4x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance4x8 = aom_obmc_variance4x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance4x8 = aom_obmc_variance4x8_avx2;
  }
  aom_obmc_variance64x128 = aom_obmc_variance64x128_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance64x128 = aom_obmc_variance64x128_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance64x128 = aom_obmc_variance64x128_avx2;
  }
  aom_obmc_variance64x16 = aom_obmc_variance64x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance64x16 = aom_obmc_variance64x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance64x16 = aom_obmc_variance64x16_avx2;
  }
  aom_obmc_variance64x32 = aom_obmc_variance64x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance64x32 = aom_obmc_variance64x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance64x32 = aom_obmc_variance64x32_avx2;
  }
  aom_obmc_variance64x64 = aom_obmc_variance64x64_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance64x64 = aom_obmc_variance64x64_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance64x64 = aom_obmc_variance64x64_avx2;
  }
  aom_obmc_variance8x16 = aom_obmc_variance8x16_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance8x16 = aom_obmc_variance8x16_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance8x16 = aom_obmc_variance8x16_avx2;
  }
  aom_obmc_variance8x32 = aom_obmc_variance8x32_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance8x32 = aom_obmc_variance8x32_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance8x32 = aom_obmc_variance8x32_avx2;
  }
  aom_obmc_variance8x4 = aom_obmc_variance8x4_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance8x4 = aom_obmc_variance8x4_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance8x4 = aom_obmc_variance8x4_avx2;
  }
  aom_obmc_variance8x8 = aom_obmc_variance8x8_c;
  if ((uVar1 & 0x20) != 0) {
    aom_obmc_variance8x8 = aom_obmc_variance8x8_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_obmc_variance8x8 = aom_obmc_variance8x8_avx2;
  }
  aom_paeth_predictor_16x16 = aom_paeth_predictor_16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_16x16 = aom_paeth_predictor_16x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_16x16 = aom_paeth_predictor_16x16_avx2;
  }
  aom_paeth_predictor_16x32 = aom_paeth_predictor_16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_16x32 = aom_paeth_predictor_16x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_16x32 = aom_paeth_predictor_16x32_avx2;
  }
  aom_paeth_predictor_16x4 = aom_paeth_predictor_16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_16x4 = aom_paeth_predictor_16x4_ssse3;
  }
  aom_paeth_predictor_16x64 = aom_paeth_predictor_16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_16x64 = aom_paeth_predictor_16x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_16x64 = aom_paeth_predictor_16x64_avx2;
  }
  aom_paeth_predictor_16x8 = aom_paeth_predictor_16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_16x8 = aom_paeth_predictor_16x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_16x8 = aom_paeth_predictor_16x8_avx2;
  }
  aom_paeth_predictor_32x16 = aom_paeth_predictor_32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_32x16 = aom_paeth_predictor_32x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_32x16 = aom_paeth_predictor_32x16_avx2;
  }
  aom_paeth_predictor_32x32 = aom_paeth_predictor_32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_32x32 = aom_paeth_predictor_32x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_32x32 = aom_paeth_predictor_32x32_avx2;
  }
  aom_paeth_predictor_32x64 = aom_paeth_predictor_32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_32x64 = aom_paeth_predictor_32x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_32x64 = aom_paeth_predictor_32x64_avx2;
  }
  aom_paeth_predictor_32x8 = aom_paeth_predictor_32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_32x8 = aom_paeth_predictor_32x8_ssse3;
  }
  aom_paeth_predictor_4x16 = aom_paeth_predictor_4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_4x16 = aom_paeth_predictor_4x16_ssse3;
  }
  aom_paeth_predictor_4x4 = aom_paeth_predictor_4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_4x4 = aom_paeth_predictor_4x4_ssse3;
  }
  aom_paeth_predictor_4x8 = aom_paeth_predictor_4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_4x8 = aom_paeth_predictor_4x8_ssse3;
  }
  aom_paeth_predictor_64x16 = aom_paeth_predictor_64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_64x16 = aom_paeth_predictor_64x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_64x16 = aom_paeth_predictor_64x16_avx2;
  }
  aom_paeth_predictor_64x32 = aom_paeth_predictor_64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_64x32 = aom_paeth_predictor_64x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_64x32 = aom_paeth_predictor_64x32_avx2;
  }
  aom_paeth_predictor_64x64 = aom_paeth_predictor_64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_64x64 = aom_paeth_predictor_64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_paeth_predictor_64x64 = aom_paeth_predictor_64x64_avx2;
  }
  aom_paeth_predictor_8x16 = aom_paeth_predictor_8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_8x16 = aom_paeth_predictor_8x16_ssse3;
  }
  aom_paeth_predictor_8x32 = aom_paeth_predictor_8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_8x32 = aom_paeth_predictor_8x32_ssse3;
  }
  aom_paeth_predictor_8x4 = aom_paeth_predictor_8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_8x4 = aom_paeth_predictor_8x4_ssse3;
  }
  aom_paeth_predictor_8x8 = aom_paeth_predictor_8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_paeth_predictor_8x8 = aom_paeth_predictor_8x8_ssse3;
  }
  aom_quantize_b = aom_quantize_b_sse2;
  if ((uVar1 & 0x10) != 0) {
    aom_quantize_b = aom_quantize_b_ssse3;
  }
  if ((uVar1 & 0x40) != 0) {
    aom_quantize_b = aom_quantize_b_avx;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_quantize_b = aom_quantize_b_avx2;
  }
  aom_quantize_b_32x32 = aom_quantize_b_32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_quantize_b_32x32 = aom_quantize_b_32x32_ssse3;
  }
  if ((uVar1 & 0x40) != 0) {
    aom_quantize_b_32x32 = aom_quantize_b_32x32_avx;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_quantize_b_32x32 = aom_quantize_b_32x32_avx2;
  }
  aom_quantize_b_64x64 = aom_quantize_b_64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_quantize_b_64x64 = aom_quantize_b_64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_quantize_b_64x64 = aom_quantize_b_64x64_avx2;
  }
  aom_quantize_b_adaptive = aom_quantize_b_adaptive_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_quantize_b_adaptive = aom_quantize_b_adaptive_avx2;
  }
  aom_sad128x128 = aom_sad128x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x128 = aom_sad128x128_avx2;
  }
  aom_sad128x128_avg = aom_sad128x128_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x128_avg = aom_sad128x128_avg_avx2;
  }
  aom_sad128x128x3d = aom_sad128x128x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x128x3d = aom_sad128x128x3d_avx2;
  }
  aom_sad128x128x4d = aom_sad128x128x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x128x4d = aom_sad128x128x4d_avx2;
  }
  aom_sad128x64 = aom_sad128x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x64 = aom_sad128x64_avx2;
  }
  aom_sad128x64_avg = aom_sad128x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x64_avg = aom_sad128x64_avg_avx2;
  }
  aom_sad128x64x3d = aom_sad128x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x64x3d = aom_sad128x64x3d_avx2;
  }
  aom_sad128x64x4d = aom_sad128x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad128x64x4d = aom_sad128x64x4d_avx2;
  }
  aom_sad16x16x3d = aom_sad16x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x16x3d = aom_sad16x16x3d_avx2;
  }
  aom_sad16x16x4d = aom_sad16x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x16x4d = aom_sad16x16x4d_avx2;
  }
  aom_sad16x32x3d = aom_sad16x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x32x3d = aom_sad16x32x3d_avx2;
  }
  aom_sad16x32x4d = aom_sad16x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x32x4d = aom_sad16x32x4d_avx2;
  }
  aom_sad16x4x3d = aom_sad16x4x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x4x3d = aom_sad16x4x3d_avx2;
  }
  aom_sad16x4x4d = aom_sad16x4x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x4x4d = aom_sad16x4x4d_avx2;
  }
  aom_sad16x64x3d = aom_sad16x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x64x3d = aom_sad16x64x3d_avx2;
  }
  aom_sad16x64x4d = aom_sad16x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x64x4d = aom_sad16x64x4d_avx2;
  }
  aom_sad16x8x3d = aom_sad16x8x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x8x3d = aom_sad16x8x3d_avx2;
  }
  aom_sad16x8x4d = aom_sad16x8x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad16x8x4d = aom_sad16x8x4d_avx2;
  }
  aom_sad32x16 = aom_sad32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x16 = aom_sad32x16_avx2;
  }
  aom_sad32x16_avg = aom_sad32x16_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x16_avg = aom_sad32x16_avg_avx2;
  }
  aom_sad32x16x3d = aom_sad32x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x16x3d = aom_sad32x16x3d_avx2;
  }
  aom_sad32x16x4d = aom_sad32x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x16x4d = aom_sad32x16x4d_avx2;
  }
  aom_sad32x32 = aom_sad32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x32 = aom_sad32x32_avx2;
  }
  aom_sad32x32_avg = aom_sad32x32_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x32_avg = aom_sad32x32_avg_avx2;
  }
  aom_sad32x32x3d = aom_sad32x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x32x3d = aom_sad32x32x3d_avx2;
  }
  aom_sad32x32x4d = aom_sad32x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x32x4d = aom_sad32x32x4d_avx2;
  }
  aom_sad32x64 = aom_sad32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x64 = aom_sad32x64_avx2;
  }
  aom_sad32x64_avg = aom_sad32x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x64_avg = aom_sad32x64_avg_avx2;
  }
  aom_sad32x64x3d = aom_sad32x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x64x3d = aom_sad32x64x3d_avx2;
  }
  aom_sad32x64x4d = aom_sad32x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x64x4d = aom_sad32x64x4d_avx2;
  }
  aom_sad32x8x3d = aom_sad32x8x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x8x3d = aom_sad32x8x3d_avx2;
  }
  aom_sad32x8x4d = aom_sad32x8x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad32x8x4d = aom_sad32x8x4d_avx2;
  }
  aom_sad64x128 = aom_sad64x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x128 = aom_sad64x128_avx2;
  }
  aom_sad64x128_avg = aom_sad64x128_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x128_avg = aom_sad64x128_avg_avx2;
  }
  aom_sad64x128x3d = aom_sad64x128x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x128x3d = aom_sad64x128x3d_avx2;
  }
  aom_sad64x128x4d = aom_sad64x128x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x128x4d = aom_sad64x128x4d_avx2;
  }
  aom_sad64x16x3d = aom_sad64x16x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x16x3d = aom_sad64x16x3d_avx2;
  }
  aom_sad64x16x4d = aom_sad64x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x16x4d = aom_sad64x16x4d_avx2;
  }
  aom_sad64x32 = aom_sad64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x32 = aom_sad64x32_avx2;
  }
  aom_sad64x32_avg = aom_sad64x32_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x32_avg = aom_sad64x32_avg_avx2;
  }
  aom_sad64x32x3d = aom_sad64x32x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x32x3d = aom_sad64x32x3d_avx2;
  }
  aom_sad64x32x4d = aom_sad64x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x32x4d = aom_sad64x32x4d_avx2;
  }
  aom_sad64x64 = aom_sad64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x64 = aom_sad64x64_avx2;
  }
  aom_sad64x64_avg = aom_sad64x64_avg_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x64_avg = aom_sad64x64_avg_avx2;
  }
  aom_sad64x64x3d = aom_sad64x64x3d_c;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x64x3d = aom_sad64x64x3d_avx2;
  }
  aom_sad64x64x4d = aom_sad64x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad64x64x4d = aom_sad64x64x4d_avx2;
  }
  aom_sad_skip_128x128 = aom_sad_skip_128x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_128x128 = aom_sad_skip_128x128_avx2;
  }
  aom_sad_skip_128x128x4d = aom_sad_skip_128x128x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_128x128x4d = aom_sad_skip_128x128x4d_avx2;
  }
  aom_sad_skip_128x64 = aom_sad_skip_128x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_128x64 = aom_sad_skip_128x64_avx2;
  }
  aom_sad_skip_128x64x4d = aom_sad_skip_128x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_128x64x4d = aom_sad_skip_128x64x4d_avx2;
  }
  aom_sad_skip_16x16x4d = aom_sad_skip_16x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_16x16x4d = aom_sad_skip_16x16x4d_avx2;
  }
  aom_sad_skip_16x32x4d = aom_sad_skip_16x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_16x32x4d = aom_sad_skip_16x32x4d_avx2;
  }
  aom_sad_skip_16x64x4d = aom_sad_skip_16x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_16x64x4d = aom_sad_skip_16x64x4d_avx2;
  }
  aom_sad_skip_32x16 = aom_sad_skip_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x16 = aom_sad_skip_32x16_avx2;
  }
  aom_sad_skip_32x16x4d = aom_sad_skip_32x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x16x4d = aom_sad_skip_32x16x4d_avx2;
  }
  aom_sad_skip_32x32 = aom_sad_skip_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x32 = aom_sad_skip_32x32_avx2;
  }
  aom_sad_skip_32x32x4d = aom_sad_skip_32x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x32x4d = aom_sad_skip_32x32x4d_avx2;
  }
  aom_sad_skip_32x64 = aom_sad_skip_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x64 = aom_sad_skip_32x64_avx2;
  }
  aom_sad_skip_32x64x4d = aom_sad_skip_32x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_32x64x4d = aom_sad_skip_32x64x4d_avx2;
  }
  aom_sad_skip_64x128 = aom_sad_skip_64x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x128 = aom_sad_skip_64x128_avx2;
  }
  aom_sad_skip_64x128x4d = aom_sad_skip_64x128x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x128x4d = aom_sad_skip_64x128x4d_avx2;
  }
  aom_sad_skip_64x16x4d = aom_sad_skip_64x16x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x16x4d = aom_sad_skip_64x16x4d_avx2;
  }
  aom_sad_skip_64x32 = aom_sad_skip_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x32 = aom_sad_skip_64x32_avx2;
  }
  aom_sad_skip_64x32x4d = aom_sad_skip_64x32x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x32x4d = aom_sad_skip_64x32x4d_avx2;
  }
  aom_sad_skip_64x64 = aom_sad_skip_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x64 = aom_sad_skip_64x64_avx2;
  }
  aom_sad_skip_64x64x4d = aom_sad_skip_64x64x4d_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sad_skip_64x64x4d = aom_sad_skip_64x64x4d_avx2;
  }
  aom_satd = aom_satd_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_satd = aom_satd_avx2;
  }
  aom_satd_lp = aom_satd_lp_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_satd_lp = aom_satd_lp_avx2;
  }
  aom_scaled_2d = aom_scaled_2d_c;
  if ((uVar1 & 0x10) != 0) {
    aom_scaled_2d = aom_scaled_2d_ssse3;
  }
  aom_smooth_h_predictor_16x16 = aom_smooth_h_predictor_16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_16x16 = aom_smooth_h_predictor_16x16_ssse3;
  }
  aom_smooth_h_predictor_16x32 = aom_smooth_h_predictor_16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_16x32 = aom_smooth_h_predictor_16x32_ssse3;
  }
  aom_smooth_h_predictor_16x4 = aom_smooth_h_predictor_16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_16x4 = aom_smooth_h_predictor_16x4_ssse3;
  }
  aom_smooth_h_predictor_16x64 = aom_smooth_h_predictor_16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_16x64 = aom_smooth_h_predictor_16x64_ssse3;
  }
  aom_smooth_h_predictor_16x8 = aom_smooth_h_predictor_16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_16x8 = aom_smooth_h_predictor_16x8_ssse3;
  }
  aom_smooth_h_predictor_32x16 = aom_smooth_h_predictor_32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_32x16 = aom_smooth_h_predictor_32x16_ssse3;
  }
  aom_smooth_h_predictor_32x32 = aom_smooth_h_predictor_32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_32x32 = aom_smooth_h_predictor_32x32_ssse3;
  }
  aom_smooth_h_predictor_32x64 = aom_smooth_h_predictor_32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_32x64 = aom_smooth_h_predictor_32x64_ssse3;
  }
  aom_smooth_h_predictor_32x8 = aom_smooth_h_predictor_32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_32x8 = aom_smooth_h_predictor_32x8_ssse3;
  }
  aom_smooth_h_predictor_4x16 = aom_smooth_h_predictor_4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_4x16 = aom_smooth_h_predictor_4x16_ssse3;
  }
  aom_smooth_h_predictor_4x4 = aom_smooth_h_predictor_4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_4x4 = aom_smooth_h_predictor_4x4_ssse3;
  }
  aom_smooth_h_predictor_4x8 = aom_smooth_h_predictor_4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_4x8 = aom_smooth_h_predictor_4x8_ssse3;
  }
  aom_smooth_h_predictor_64x16 = aom_smooth_h_predictor_64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_64x16 = aom_smooth_h_predictor_64x16_ssse3;
  }
  aom_smooth_h_predictor_64x32 = aom_smooth_h_predictor_64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_64x32 = aom_smooth_h_predictor_64x32_ssse3;
  }
  aom_smooth_h_predictor_64x64 = aom_smooth_h_predictor_64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_64x64 = aom_smooth_h_predictor_64x64_ssse3;
  }
  aom_smooth_h_predictor_8x16 = aom_smooth_h_predictor_8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_8x16 = aom_smooth_h_predictor_8x16_ssse3;
  }
  aom_smooth_h_predictor_8x32 = aom_smooth_h_predictor_8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_8x32 = aom_smooth_h_predictor_8x32_ssse3;
  }
  aom_smooth_h_predictor_8x4 = aom_smooth_h_predictor_8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_8x4 = aom_smooth_h_predictor_8x4_ssse3;
  }
  aom_smooth_h_predictor_8x8 = aom_smooth_h_predictor_8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_h_predictor_8x8 = aom_smooth_h_predictor_8x8_ssse3;
  }
  aom_smooth_predictor_16x16 = aom_smooth_predictor_16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_16x16 = aom_smooth_predictor_16x16_ssse3;
  }
  aom_smooth_predictor_16x32 = aom_smooth_predictor_16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_16x32 = aom_smooth_predictor_16x32_ssse3;
  }
  aom_smooth_predictor_16x4 = aom_smooth_predictor_16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_16x4 = aom_smooth_predictor_16x4_ssse3;
  }
  aom_smooth_predictor_16x64 = aom_smooth_predictor_16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_16x64 = aom_smooth_predictor_16x64_ssse3;
  }
  aom_smooth_predictor_16x8 = aom_smooth_predictor_16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_16x8 = aom_smooth_predictor_16x8_ssse3;
  }
  aom_smooth_predictor_32x16 = aom_smooth_predictor_32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_32x16 = aom_smooth_predictor_32x16_ssse3;
  }
  aom_smooth_predictor_32x32 = aom_smooth_predictor_32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_32x32 = aom_smooth_predictor_32x32_ssse3;
  }
  aom_smooth_predictor_32x64 = aom_smooth_predictor_32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_32x64 = aom_smooth_predictor_32x64_ssse3;
  }
  aom_smooth_predictor_32x8 = aom_smooth_predictor_32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_32x8 = aom_smooth_predictor_32x8_ssse3;
  }
  aom_smooth_predictor_4x16 = aom_smooth_predictor_4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_4x16 = aom_smooth_predictor_4x16_ssse3;
  }
  aom_smooth_predictor_4x4 = aom_smooth_predictor_4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_4x4 = aom_smooth_predictor_4x4_ssse3;
  }
  aom_smooth_predictor_4x8 = aom_smooth_predictor_4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_4x8 = aom_smooth_predictor_4x8_ssse3;
  }
  aom_smooth_predictor_64x16 = aom_smooth_predictor_64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_64x16 = aom_smooth_predictor_64x16_ssse3;
  }
  aom_smooth_predictor_64x32 = aom_smooth_predictor_64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_64x32 = aom_smooth_predictor_64x32_ssse3;
  }
  aom_smooth_predictor_64x64 = aom_smooth_predictor_64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_64x64 = aom_smooth_predictor_64x64_ssse3;
  }
  aom_smooth_predictor_8x16 = aom_smooth_predictor_8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_8x16 = aom_smooth_predictor_8x16_ssse3;
  }
  aom_smooth_predictor_8x32 = aom_smooth_predictor_8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_8x32 = aom_smooth_predictor_8x32_ssse3;
  }
  aom_smooth_predictor_8x4 = aom_smooth_predictor_8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_8x4 = aom_smooth_predictor_8x4_ssse3;
  }
  aom_smooth_predictor_8x8 = aom_smooth_predictor_8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_predictor_8x8 = aom_smooth_predictor_8x8_ssse3;
  }
  aom_smooth_v_predictor_16x16 = aom_smooth_v_predictor_16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_16x16 = aom_smooth_v_predictor_16x16_ssse3;
  }
  aom_smooth_v_predictor_16x32 = aom_smooth_v_predictor_16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_16x32 = aom_smooth_v_predictor_16x32_ssse3;
  }
  aom_smooth_v_predictor_16x4 = aom_smooth_v_predictor_16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_16x4 = aom_smooth_v_predictor_16x4_ssse3;
  }
  aom_smooth_v_predictor_16x64 = aom_smooth_v_predictor_16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_16x64 = aom_smooth_v_predictor_16x64_ssse3;
  }
  aom_smooth_v_predictor_16x8 = aom_smooth_v_predictor_16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_16x8 = aom_smooth_v_predictor_16x8_ssse3;
  }
  aom_smooth_v_predictor_32x16 = aom_smooth_v_predictor_32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_32x16 = aom_smooth_v_predictor_32x16_ssse3;
  }
  aom_smooth_v_predictor_32x32 = aom_smooth_v_predictor_32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_32x32 = aom_smooth_v_predictor_32x32_ssse3;
  }
  aom_smooth_v_predictor_32x64 = aom_smooth_v_predictor_32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_32x64 = aom_smooth_v_predictor_32x64_ssse3;
  }
  aom_smooth_v_predictor_32x8 = aom_smooth_v_predictor_32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_32x8 = aom_smooth_v_predictor_32x8_ssse3;
  }
  aom_smooth_v_predictor_4x16 = aom_smooth_v_predictor_4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_4x16 = aom_smooth_v_predictor_4x16_ssse3;
  }
  aom_smooth_v_predictor_4x4 = aom_smooth_v_predictor_4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_4x4 = aom_smooth_v_predictor_4x4_ssse3;
  }
  aom_smooth_v_predictor_4x8 = aom_smooth_v_predictor_4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_4x8 = aom_smooth_v_predictor_4x8_ssse3;
  }
  aom_smooth_v_predictor_64x16 = aom_smooth_v_predictor_64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_64x16 = aom_smooth_v_predictor_64x16_ssse3;
  }
  aom_smooth_v_predictor_64x32 = aom_smooth_v_predictor_64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_64x32 = aom_smooth_v_predictor_64x32_ssse3;
  }
  aom_smooth_v_predictor_64x64 = aom_smooth_v_predictor_64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_64x64 = aom_smooth_v_predictor_64x64_ssse3;
  }
  aom_smooth_v_predictor_8x16 = aom_smooth_v_predictor_8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_8x16 = aom_smooth_v_predictor_8x16_ssse3;
  }
  aom_smooth_v_predictor_8x32 = aom_smooth_v_predictor_8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_8x32 = aom_smooth_v_predictor_8x32_ssse3;
  }
  aom_smooth_v_predictor_8x4 = aom_smooth_v_predictor_8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_8x4 = aom_smooth_v_predictor_8x4_ssse3;
  }
  aom_smooth_v_predictor_8x8 = aom_smooth_v_predictor_8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_smooth_v_predictor_8x8 = aom_smooth_v_predictor_8x8_ssse3;
  }
  aom_sse = aom_sse_c;
  if ((uVar1 & 0x20) != 0) {
    aom_sse = aom_sse_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sse = aom_sse_avx2;
  }
  aom_sub_pixel_avg_variance128x128 = aom_sub_pixel_avg_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance128x128 = aom_sub_pixel_avg_variance128x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance128x128 = aom_sub_pixel_avg_variance128x128_avx2;
  }
  aom_sub_pixel_avg_variance128x64 = aom_sub_pixel_avg_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance128x64 = aom_sub_pixel_avg_variance128x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance128x64 = aom_sub_pixel_avg_variance128x64_avx2;
  }
  aom_sub_pixel_avg_variance16x16 = aom_sub_pixel_avg_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance16x16 = aom_sub_pixel_avg_variance16x16_ssse3;
  }
  aom_sub_pixel_avg_variance16x32 = aom_sub_pixel_avg_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance16x32 = aom_sub_pixel_avg_variance16x32_ssse3;
  }
  aom_sub_pixel_avg_variance16x4 = aom_sub_pixel_avg_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance16x4 = aom_sub_pixel_avg_variance16x4_ssse3;
  }
  aom_sub_pixel_avg_variance16x64 = aom_sub_pixel_avg_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance16x64 = aom_sub_pixel_avg_variance16x64_ssse3;
  }
  aom_sub_pixel_avg_variance16x8 = aom_sub_pixel_avg_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance16x8 = aom_sub_pixel_avg_variance16x8_ssse3;
  }
  aom_sub_pixel_avg_variance32x16 = aom_sub_pixel_avg_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance32x16 = aom_sub_pixel_avg_variance32x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance32x16 = aom_sub_pixel_avg_variance32x16_avx2;
  }
  aom_sub_pixel_avg_variance32x32 = aom_sub_pixel_avg_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance32x32 = aom_sub_pixel_avg_variance32x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance32x32 = aom_sub_pixel_avg_variance32x32_avx2;
  }
  aom_sub_pixel_avg_variance32x64 = aom_sub_pixel_avg_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance32x64 = aom_sub_pixel_avg_variance32x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance32x64 = aom_sub_pixel_avg_variance32x64_avx2;
  }
  aom_sub_pixel_avg_variance32x8 = aom_sub_pixel_avg_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance32x8 = aom_sub_pixel_avg_variance32x8_ssse3;
  }
  aom_sub_pixel_avg_variance4x16 = aom_sub_pixel_avg_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance4x16 = aom_sub_pixel_avg_variance4x16_ssse3;
  }
  aom_sub_pixel_avg_variance4x4 = aom_sub_pixel_avg_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance4x4 = aom_sub_pixel_avg_variance4x4_ssse3;
  }
  aom_sub_pixel_avg_variance4x8 = aom_sub_pixel_avg_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance4x8 = aom_sub_pixel_avg_variance4x8_ssse3;
  }
  aom_sub_pixel_avg_variance64x128 = aom_sub_pixel_avg_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance64x128 = aom_sub_pixel_avg_variance64x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance64x128 = aom_sub_pixel_avg_variance64x128_avx2;
  }
  aom_sub_pixel_avg_variance64x16 = aom_sub_pixel_avg_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance64x16 = aom_sub_pixel_avg_variance64x16_ssse3;
  }
  aom_sub_pixel_avg_variance64x32 = aom_sub_pixel_avg_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance64x32 = aom_sub_pixel_avg_variance64x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance64x32 = aom_sub_pixel_avg_variance64x32_avx2;
  }
  aom_sub_pixel_avg_variance64x64 = aom_sub_pixel_avg_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance64x64 = aom_sub_pixel_avg_variance64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_avg_variance64x64 = aom_sub_pixel_avg_variance64x64_avx2;
  }
  aom_sub_pixel_avg_variance8x16 = aom_sub_pixel_avg_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance8x16 = aom_sub_pixel_avg_variance8x16_ssse3;
  }
  aom_sub_pixel_avg_variance8x32 = aom_sub_pixel_avg_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance8x32 = aom_sub_pixel_avg_variance8x32_ssse3;
  }
  aom_sub_pixel_avg_variance8x4 = aom_sub_pixel_avg_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance8x4 = aom_sub_pixel_avg_variance8x4_ssse3;
  }
  aom_sub_pixel_avg_variance8x8 = aom_sub_pixel_avg_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_avg_variance8x8 = aom_sub_pixel_avg_variance8x8_ssse3;
  }
  aom_sub_pixel_variance128x128 = aom_sub_pixel_variance128x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance128x128 = aom_sub_pixel_variance128x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance128x128 = aom_sub_pixel_variance128x128_avx2;
  }
  aom_sub_pixel_variance128x64 = aom_sub_pixel_variance128x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance128x64 = aom_sub_pixel_variance128x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance128x64 = aom_sub_pixel_variance128x64_avx2;
  }
  aom_sub_pixel_variance16x16 = aom_sub_pixel_variance16x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance16x16 = aom_sub_pixel_variance16x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance16x16 = aom_sub_pixel_variance16x16_avx2;
  }
  aom_sub_pixel_variance16x32 = aom_sub_pixel_variance16x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance16x32 = aom_sub_pixel_variance16x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance16x32 = aom_sub_pixel_variance16x32_avx2;
  }
  aom_sub_pixel_variance16x4 = aom_sub_pixel_variance16x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance16x4 = aom_sub_pixel_variance16x4_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance16x4 = aom_sub_pixel_variance16x4_avx2;
  }
  aom_sub_pixel_variance16x64 = aom_sub_pixel_variance16x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance16x64 = aom_sub_pixel_variance16x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance16x64 = aom_sub_pixel_variance16x64_avx2;
  }
  aom_sub_pixel_variance16x8 = aom_sub_pixel_variance16x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance16x8 = aom_sub_pixel_variance16x8_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance16x8 = aom_sub_pixel_variance16x8_avx2;
  }
  aom_sub_pixel_variance32x16 = aom_sub_pixel_variance32x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance32x16 = aom_sub_pixel_variance32x16_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance32x16 = aom_sub_pixel_variance32x16_avx2;
  }
  aom_sub_pixel_variance32x32 = aom_sub_pixel_variance32x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance32x32 = aom_sub_pixel_variance32x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance32x32 = aom_sub_pixel_variance32x32_avx2;
  }
  aom_sub_pixel_variance32x64 = aom_sub_pixel_variance32x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance32x64 = aom_sub_pixel_variance32x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance32x64 = aom_sub_pixel_variance32x64_avx2;
  }
  aom_sub_pixel_variance32x8 = aom_sub_pixel_variance32x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance32x8 = aom_sub_pixel_variance32x8_ssse3;
  }
  aom_sub_pixel_variance4x16 = aom_sub_pixel_variance4x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance4x16 = aom_sub_pixel_variance4x16_ssse3;
  }
  aom_sub_pixel_variance4x4 = aom_sub_pixel_variance4x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance4x4 = aom_sub_pixel_variance4x4_ssse3;
  }
  aom_sub_pixel_variance4x8 = aom_sub_pixel_variance4x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance4x8 = aom_sub_pixel_variance4x8_ssse3;
  }
  aom_sub_pixel_variance64x128 = aom_sub_pixel_variance64x128_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance64x128 = aom_sub_pixel_variance64x128_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance64x128 = aom_sub_pixel_variance64x128_avx2;
  }
  aom_sub_pixel_variance64x16 = aom_sub_pixel_variance64x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance64x16 = aom_sub_pixel_variance64x16_ssse3;
  }
  aom_sub_pixel_variance64x32 = aom_sub_pixel_variance64x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance64x32 = aom_sub_pixel_variance64x32_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance64x32 = aom_sub_pixel_variance64x32_avx2;
  }
  aom_sub_pixel_variance64x64 = aom_sub_pixel_variance64x64_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance64x64 = aom_sub_pixel_variance64x64_ssse3;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_sub_pixel_variance64x64 = aom_sub_pixel_variance64x64_avx2;
  }
  aom_sub_pixel_variance8x16 = aom_sub_pixel_variance8x16_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance8x16 = aom_sub_pixel_variance8x16_ssse3;
  }
  aom_sub_pixel_variance8x32 = aom_sub_pixel_variance8x32_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance8x32 = aom_sub_pixel_variance8x32_ssse3;
  }
  aom_sub_pixel_variance8x4 = aom_sub_pixel_variance8x4_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance8x4 = aom_sub_pixel_variance8x4_ssse3;
  }
  aom_sub_pixel_variance8x8 = aom_sub_pixel_variance8x8_c;
  if ((uVar1 & 0x10) != 0) {
    aom_sub_pixel_variance8x8 = aom_sub_pixel_variance8x8_ssse3;
  }
  aom_subtract_block = aom_subtract_block_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_subtract_block = aom_subtract_block_avx2;
  }
  aom_sum_squares_2d_i16 = aom_sum_squares_2d_i16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sum_squares_2d_i16 = aom_sum_squares_2d_i16_avx2;
  }
  aom_sum_sse_2d_i16 = aom_sum_sse_2d_i16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_sum_sse_2d_i16 = aom_sum_sse_2d_i16_avx2;
  }
  aom_v_predictor_32x16 = aom_v_predictor_32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_32x16 = aom_v_predictor_32x16_avx2;
  }
  aom_v_predictor_32x32 = aom_v_predictor_32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_32x32 = aom_v_predictor_32x32_avx2;
  }
  aom_v_predictor_32x64 = aom_v_predictor_32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_32x64 = aom_v_predictor_32x64_avx2;
  }
  aom_v_predictor_64x16 = aom_v_predictor_64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_64x16 = aom_v_predictor_64x16_avx2;
  }
  aom_v_predictor_64x32 = aom_v_predictor_64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_64x32 = aom_v_predictor_64x32_avx2;
  }
  aom_v_predictor_64x64 = aom_v_predictor_64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_v_predictor_64x64 = aom_v_predictor_64x64_avx2;
  }
  aom_var_2d_u16 = aom_var_2d_u16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_var_2d_u16 = aom_var_2d_u16_avx2;
  }
  aom_var_2d_u8 = aom_var_2d_u8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_var_2d_u8 = aom_var_2d_u8_avx2;
  }
  aom_variance128x128 = aom_variance128x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance128x128 = aom_variance128x128_avx2;
  }
  aom_variance128x64 = aom_variance128x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance128x64 = aom_variance128x64_avx2;
  }
  aom_variance16x16 = aom_variance16x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance16x16 = aom_variance16x16_avx2;
  }
  aom_variance16x32 = aom_variance16x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance16x32 = aom_variance16x32_avx2;
  }
  aom_variance16x4 = aom_variance16x4_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance16x4 = aom_variance16x4_avx2;
  }
  aom_variance16x64 = aom_variance16x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance16x64 = aom_variance16x64_avx2;
  }
  aom_variance16x8 = aom_variance16x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance16x8 = aom_variance16x8_avx2;
  }
  aom_variance32x16 = aom_variance32x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance32x16 = aom_variance32x16_avx2;
  }
  aom_variance32x32 = aom_variance32x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance32x32 = aom_variance32x32_avx2;
  }
  aom_variance32x64 = aom_variance32x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance32x64 = aom_variance32x64_avx2;
  }
  aom_variance32x8 = aom_variance32x8_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance32x8 = aom_variance32x8_avx2;
  }
  aom_variance64x128 = aom_variance64x128_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance64x128 = aom_variance64x128_avx2;
  }
  aom_variance64x16 = aom_variance64x16_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance64x16 = aom_variance64x16_avx2;
  }
  aom_variance64x32 = aom_variance64x32_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance64x32 = aom_variance64x32_avx2;
  }
  aom_variance64x64 = aom_variance64x64_sse2;
  if ((uVar1 & 0x80) != 0) {
    aom_variance64x64 = aom_variance64x64_avx2;
  }
  aom_vector_var = aom_vector_var_c;
  if ((uVar1 & 0x20) != 0) {
    aom_vector_var = aom_vector_var_sse4_1;
  }
  if ((uVar1 & 0x80) != 0) {
    aom_vector_var = aom_vector_var_avx2;
  }
  return;
}

Assistant:

static void setup_rtcd_internal(void)
{
    int flags = x86_simd_caps();

    (void)flags;

}